

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O1

RenderSampleAnalyzeResult
deqp::gles3::Performance::anon_unknown_1::
analyzeSampleResults<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>
          (TestLog *log,
          vector<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
          *samples)

{
  ulong uVar1;
  pointer pRVar2;
  pointer pfVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  deUint64 *pdVar6;
  int *piVar7;
  pointer pRVar8;
  SampleBuilder *pSVar9;
  uint uVar10;
  ulong target;
  long lVar11;
  int endNdx;
  size_type __n;
  ulong uVar12;
  long lVar13;
  uint uVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  RenderSampleAnalyzeResult RVar20;
  vector<float,_std::allocator<float>_> processingRates;
  vector<unsigned_long,_std::allocator<unsigned_long>_> values;
  size_type __dnew_6;
  LineParametersWithConfidence contributionFitting;
  size_type __dnew_2;
  size_type __dnew_1;
  size_type __dnew;
  size_type __dnew_8;
  size_type __dnew_4;
  size_type __dnew_9;
  ScopedLogSection section_1;
  LineParametersWithConfidence theilSenFitting;
  ScopedLogSection section_2;
  ScopedLogSection section;
  StatsType resultStats;
  undefined1 local_ae0 [12];
  float fStack_ad4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_ad0;
  string local_ac0;
  string local_aa0;
  qpSampleValueTag local_a80;
  float local_a7c;
  undefined1 local_a78 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_a68;
  string local_a58;
  string local_a38;
  qpSampleValueTag local_a18;
  float local_a14;
  LogNumber<float> local_a10;
  undefined1 local_9a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_998;
  LogNumber<float> local_988;
  LogNumber<float> local_920;
  undefined1 local_8b8 [16];
  LogNumber<float> local_8a0;
  LogNumber<float> local_838;
  LogNumber<float> local_7d0;
  string local_768;
  string local_748;
  LogNumber<float> local_728;
  LogNumber<float> local_6c0;
  LogNumber<float> local_658;
  LogNumber<float> local_5f0;
  string local_588;
  string local_568;
  string local_548;
  string local_528;
  string local_508;
  LineParametersWithConfidence local_4e4;
  string local_4c8;
  string local_4a8;
  string local_488;
  string local_468;
  string local_448;
  string local_428;
  string local_408;
  string local_3e8;
  string local_3c8;
  string local_3a8;
  string local_388;
  string local_368;
  string local_348;
  string local_328;
  string local_308;
  string local_2e8;
  string local_2c8;
  string local_2a8;
  string local_288;
  string local_268;
  string local_248;
  string local_228;
  string local_208;
  float local_1e4;
  float local_1e0;
  float local_1dc;
  float local_1d8;
  float local_1d4;
  float local_1d0;
  float local_1cc;
  float local_1c8;
  float local_1c4;
  float local_1c0;
  float local_1bc;
  ScopedLogSection local_1b8;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  SingleOperationStatistics local_10c;
  SingleOperationStatistics local_f8;
  SingleOperationStatistics local_e4;
  SingleOperationStatistics local_d0;
  float local_bc;
  float local_b8;
  float local_b4;
  float local_b0;
  float local_ac;
  SingleOperationStatistics local_a8;
  float local_94;
  undefined4 uStack_90;
  float fStack_8c;
  float fStack_88;
  undefined4 local_84;
  float local_80;
  float local_7c;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>
            (&local_4e4,samples,0,
             (int)((ulong)((long)(samples->
                                 super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(samples->
                                super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
                                )._M_impl.super__Vector_impl_data._M_start) >> 3) * 0x38e38e39,1,
             0x30);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_a78,
             ((long)(samples->
                    super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(samples->
                    super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x71c71c71c71c71c7,
             (allocator_type *)local_ae0);
  pRVar8 = (samples->
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  __n = ((long)(samples->
               super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
               )._M_impl.super__Vector_impl_data._M_finish - (long)pRVar8 >> 3) *
        -0x71c71c71c71c71c7;
  uVar10 = (uint)__n;
  if (0 < (int)uVar10) {
    pdVar6 = &(pRVar8->duration).fitResponseDuration;
    uVar12 = 0;
    do {
      *(deUint64 *)(local_a78._0_8_ + uVar12 * 8) = *pdVar6;
      uVar12 = uVar12 + 1;
      pdVar6 = pdVar6 + 9;
    } while ((uVar10 & 0x7fffffff) != uVar12);
  }
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_ae0,__n,(allocator_type *)&local_a10);
  uVar4 = local_ae0._0_8_;
  pRVar8 = (samples->
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar10 = (int)((long)(samples->
                       super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish - (long)pRVar8 >> 3) * 0x38e38e39
  ;
  if (0 < (int)uVar10) {
    piVar7 = &pRVar8->renderDataSize;
    uVar12 = 0;
    do {
      *(float *)(local_ae0._0_8_ + uVar12 * 4) =
           (float)*piVar7 / (((float)*(ulong *)(local_a78._0_8_ + uVar12 * 8) / 1000.0) / 1000.0);
      uVar12 = uVar12 + 1;
      piVar7 = piVar7 + 0x12;
    } while ((uVar10 & 0x7fffffff) != uVar12);
  }
  pfVar3 = (pointer)CONCAT44(fStack_ad4,local_ae0._8_4_);
  if ((pointer)local_ae0._0_8_ != pfVar3) {
    uVar12 = (long)pfVar3 - local_ae0._0_8_ >> 2;
    lVar11 = 0x3f;
    if (uVar12 != 0) {
      for (; uVar12 >> lVar11 == 0; lVar11 = lVar11 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_ae0._0_8_,pfVar3,((uint)lVar11 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (uVar4,pfVar3);
  }
  uVar4 = local_ae0._0_8_;
  fVar15 = (float)((CONCAT44(fStack_ad4,local_ae0._8_4_) - local_ae0._0_8_ >> 2) - 1) * 0.5;
  fVar16 = floorf(fVar15);
  fVar15 = fVar15 - (float)(int)fVar16;
  local_94 = (1.0 - fVar15) * *(float *)(uVar4 + (long)(int)fVar16 * 4) +
             fVar15 * *(float *)(uVar4 + (long)((int)fVar16 + 1) * 4);
  if ((pointer)uVar4 != (pointer)0x0) {
    operator_delete((void *)uVar4,local_ad0._M_allocated_capacity - uVar4);
  }
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_ae0,
             ((long)(samples->
                    super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(samples->
                    super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x71c71c71c71c71c7,
             (allocator_type *)&local_a10);
  uVar4 = local_ae0._0_8_;
  pRVar8 = (samples->
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar10 = (int)((long)(samples->
                       super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish - (long)pRVar8 >> 3) * 0x38e38e39
  ;
  if (0 < (int)uVar10) {
    piVar7 = &pRVar8->renderDataSize;
    uVar12 = 0;
    do {
      *(float *)(local_ae0._0_8_ + uVar12 * 4) =
           (float)*(ulong *)(local_a78._0_8_ + uVar12 * 8) -
           ((float)*piVar7 * local_4e4.coefficient + local_4e4.offset);
      uVar12 = uVar12 + 1;
      piVar7 = piVar7 + 0x12;
    } while ((uVar10 & 0x7fffffff) != uVar12);
  }
  pfVar3 = (pointer)CONCAT44(fStack_ad4,local_ae0._8_4_);
  if ((pointer)local_ae0._0_8_ != pfVar3) {
    uVar12 = (long)pfVar3 - local_ae0._0_8_ >> 2;
    lVar11 = 0x3f;
    if (uVar12 != 0) {
      for (; uVar12 >> lVar11 == 0; lVar11 = lVar11 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_ae0._0_8_,pfVar3,((uint)lVar11 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (uVar4,pfVar3);
  }
  uVar4 = local_ae0._0_8_;
  uStack_90 = *(undefined4 *)(CONCAT44(fStack_ad4,local_ae0._8_4_) + -4);
  fVar16 = (float)((CONCAT44(fStack_ad4,local_ae0._8_4_) - local_ae0._0_8_ >> 2) - 1);
  local_8b8._0_4_ = fVar16 * 0.9;
  fVar15 = floorf((float)local_8b8._0_4_);
  fStack_8c = (1.0 - ((float)local_8b8._0_4_ - (float)(int)fVar15)) *
              *(float *)(uVar4 + (long)(int)fVar15 * 4) +
              ((float)local_8b8._0_4_ - (float)(int)fVar15) *
              *(float *)(uVar4 + (long)((int)fVar15 + 1) * 4);
  fVar16 = fVar16 * 0.5;
  fVar15 = floorf(fVar16);
  fVar16 = fVar16 - (float)(int)fVar15;
  fStack_88 = (1.0 - fVar16) * *(float *)(uVar4 + (long)(int)fVar15 * 4) +
              fVar16 * *(float *)(uVar4 + (long)((int)fVar15 + 1) * 4);
  if ((pointer)uVar4 != (pointer)0x0) {
    operator_delete((void *)uVar4,local_ad0._M_allocated_capacity - uVar4);
  }
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_ae0,
             ((long)(samples->
                    super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(samples->
                    super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x71c71c71c71c71c7,
             (allocator_type *)&local_a10);
  uVar4 = local_ae0._0_8_;
  pRVar8 = (samples->
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar10 = (int)((long)(samples->
                       super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish - (long)pRVar8 >> 3) * 0x38e38e39
  ;
  if (0 < (int)uVar10) {
    piVar7 = &pRVar8->renderDataSize;
    uVar12 = 0;
    do {
      fVar15 = (float)*piVar7 * local_4e4.coefficient + local_4e4.offset;
      fVar16 = 0.0;
      if (1.0 <= fVar15) {
        fVar16 = ((float)*(ulong *)(local_a78._0_8_ + uVar12 * 8) - fVar15) / fVar15;
      }
      *(float *)(local_ae0._0_8_ + uVar12 * 4) = fVar16;
      uVar12 = uVar12 + 1;
      piVar7 = piVar7 + 0x12;
    } while ((uVar10 & 0x7fffffff) != uVar12);
  }
  pfVar3 = (pointer)CONCAT44(fStack_ad4,local_ae0._8_4_);
  if ((pointer)local_ae0._0_8_ != pfVar3) {
    uVar12 = (long)pfVar3 - local_ae0._0_8_ >> 2;
    lVar11 = 0x3f;
    if (uVar12 != 0) {
      for (; uVar12 >> lVar11 == 0; lVar11 = lVar11 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_ae0._0_8_,pfVar3,((uint)lVar11 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (uVar4,pfVar3);
  }
  local_84 = *(undefined4 *)(CONCAT44(fStack_ad4,local_ae0._8_4_) + -4);
  fVar16 = (float)((CONCAT44(fStack_ad4,local_ae0._8_4_) - local_ae0._0_8_ >> 2) - 1);
  fVar15 = fVar16 * 0.9;
  local_8b8._0_4_ = fVar15;
  fVar15 = floorf(fVar15);
  local_80 = (1.0 - ((float)local_8b8._0_4_ - (float)(int)fVar15)) *
             *(float *)(local_ae0._0_8_ + (long)(int)fVar15 * 4) +
             ((float)local_8b8._0_4_ - (float)(int)fVar15) *
             *(float *)(local_ae0._0_8_ + (long)((int)fVar15 + 1) * 4);
  fVar16 = fVar16 * 0.5;
  fVar15 = floorf(fVar16);
  fVar16 = fVar16 - (float)(int)fVar15;
  local_7c = (1.0 - fVar16) * *(float *)(local_ae0._0_8_ + (long)(int)fVar15 * 4) +
             fVar16 * *(float *)(local_ae0._0_8_ + (long)((int)fVar15 + 1) * 4);
  if ((pointer)local_ae0._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_ae0._0_8_,local_ad0._M_allocated_capacity - local_ae0._0_8_);
  }
  uVar5 = local_a78._8_8_;
  uVar4 = local_a78._0_8_;
  if (local_a78._0_8_ != local_a78._8_8_) {
    uVar12 = (long)(local_a78._8_8_ - local_a78._0_8_) >> 3;
    lVar11 = 0x3f;
    if (uVar12 != 0) {
      for (; uVar12 >> lVar11 == 0; lVar11 = lVar11 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_a78._0_8_,local_a78._8_8_,((uint)lVar11 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (uVar4,uVar5);
  }
  local_bc = (float)*(ulong *)local_a78._0_8_;
  local_b8 = (float)(ulong)(((pointer)(local_a78._8_8_ + -0x10))->value).int64;
  fVar16 = (float)(((long)(local_a78._8_8_ - local_a78._0_8_) >> 3) - 1);
  local_8b8._0_4_ = fVar16 * 0.5;
  fVar15 = floorf(fVar16 * 0.5);
  local_b4 = (float)*(ulong *)(local_a78._0_8_ + (long)((int)fVar15 + 1) * 8) *
             ((float)local_8b8._0_4_ - (float)(int)fVar15) +
             (float)*(ulong *)(local_a78._0_8_ + (long)(int)fVar15 * 8) *
             (1.0 - ((float)local_8b8._0_4_ - (float)(int)fVar15));
  local_8b8._0_4_ = fVar16 * 0.1;
  fVar15 = floorf(fVar16 * 0.1);
  local_b0 = (float)*(ulong *)(local_a78._0_8_ + (long)((int)fVar15 + 1) * 8) *
             ((float)local_8b8._0_4_ - (float)(int)fVar15) +
             (float)*(ulong *)(local_a78._0_8_ + (long)(int)fVar15 * 8) *
             (1.0 - ((float)local_8b8._0_4_ - (float)(int)fVar15));
  fVar15 = floorf(fVar16 * 0.9);
  uVar12 = *(ulong *)(local_a78._0_8_ + (long)(int)fVar15 * 8);
  target = uVar12;
  if ((long)uVar12 < 0) {
    target = (ulong)((uint)uVar12 & 1) | uVar12 >> 1;
  }
  fVar16 = fVar16 * 0.9 - (float)(int)fVar15;
  uVar1 = *(ulong *)(local_a78._0_8_ + (long)((int)fVar15 + 1) * 8);
  if ((long)uVar1 < 0) {
    target = uVar1 >> 1;
  }
  local_ac = (float)uVar1 * fVar16 + (float)uVar12 * (1.0 - fVar16);
  operator_delete((void *)local_a78._0_8_,aStack_a68._M_allocated_capacity - local_a78._0_8_);
  (anonymous_namespace)::
  calculateSingleOperationStatistics<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>>
            (&local_10c,(_anonymous_namespace_ *)samples,
             (vector<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
              *)0x0,target);
  (anonymous_namespace)::
  calculateSingleOperationStatistics<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>>
            (&local_f8,(_anonymous_namespace_ *)samples,
             (vector<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
              *)0x8,target);
  (anonymous_namespace)::
  calculateSingleOperationStatistics<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>>
            (&local_e4,(_anonymous_namespace_ *)samples,
             (vector<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
              *)0x10,target);
  (anonymous_namespace)::
  calculateSingleOperationStatistics<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>>
            (&local_d0,(_anonymous_namespace_ *)samples,
             (vector<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
              *)0x18,target);
  (anonymous_namespace)::
  calculateSingleOperationStatistics<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>>
            (&local_a8,(_anonymous_namespace_ *)samples,
             (vector<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
              *)0x20,target);
  local_a78._0_8_ = &aStack_a68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a78,"Samples","");
  local_ae0._0_8_ = &local_ad0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_ae0,"Samples","");
  tcu::ScopedLogSection::ScopedLogSection
            ((ScopedLogSection *)&local_1b0,log,(string *)local_a78,(string *)local_ae0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ae0._0_8_ != &local_ad0) {
    operator_delete((void *)local_ae0._0_8_,local_ad0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a78._0_8_ != &aStack_a68) {
    operator_delete((void *)local_a78._0_8_,aStack_a68._M_allocated_capacity + 1);
  }
  local_658.m_name._M_dataplus._M_p = (pointer)&local_658.m_name.field_2;
  local_658.m_name.field_2._M_allocated_capacity._0_2_ = 0x6153;
  local_658.m_name.field_2._M_local_buf[2] = 'm';
  local_658.m_name.field_2._M_allocated_capacity._3_4_ = 0x73656c70;
  local_658.m_name._M_string_length = 7;
  local_658.m_name.field_2._M_local_buf[7] = '\0';
  local_998._M_allocated_capacity._0_4_ = 0x706d6153;
  local_9a8._8_8_ = 7;
  local_998._M_allocated_capacity._4_4_ = 0x73656c;
  local_9a8._0_8_ = &local_998;
  tcu::LogSampleList::LogSampleList
            ((LogSampleList *)&local_728,&local_658.m_name,(string *)local_9a8);
  tcu::TestLog::startSampleList(log,&local_728.m_name,&local_728.m_desc);
  tcu::TestLog::startSampleInfo(log);
  local_588.field_2._M_allocated_capacity = 0x657a695361746144;
  local_588._M_string_length = 8;
  local_588.field_2._M_local_buf[8] = '\0';
  local_208.field_2._M_allocated_capacity._0_6_ = 0x702061746144;
  local_208.field_2._M_allocated_capacity._6_2_ = 0x6f72;
  local_208.field_2._8_6_ = 0x646573736563;
  local_208._M_string_length = 0xe;
  local_208.field_2._M_local_buf[0xe] = '\0';
  local_228.field_2._M_allocated_capacity._0_4_ = 0x65747962;
  local_228.field_2._M_allocated_capacity._4_2_ = 0x73;
  local_228._M_string_length = 5;
  local_588._M_dataplus._M_p = (pointer)&local_588.field_2;
  local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
  local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
  tcu::LogValueInfo::LogValueInfo
            ((LogValueInfo *)local_a78,&local_588,&local_208,&local_228,
             QP_SAMPLE_VALUE_TAG_PREDICTOR);
  tcu::TestLog::writeValueInfo(log,(string *)local_a78,&local_a58,&local_a38,local_a18);
  local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
  local_248.field_2._M_allocated_capacity = 0x695364616f6c7055;
  local_248.field_2._8_2_ = 0x657a;
  local_248._M_string_length = 10;
  local_248.field_2._M_local_buf[10] = '\0';
  local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
  local_268.field_2._M_allocated_capacity._0_5_ = 0x2061746144;
  local_268.field_2._M_allocated_capacity._5_3_ = 0x6c7075;
  local_268.field_2._8_5_ = 0x646564616f;
  local_268._M_string_length = 0xd;
  local_268.field_2._M_local_buf[0xd] = '\0';
  local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
  local_288.field_2._M_allocated_capacity._0_4_ = 0x65747962;
  local_288.field_2._M_allocated_capacity._4_2_ = 0x73;
  local_288._M_string_length = 5;
  tcu::LogValueInfo::LogValueInfo
            ((LogValueInfo *)local_ae0,&local_248,&local_268,&local_288,
             QP_SAMPLE_VALUE_TAG_PREDICTOR);
  tcu::TestLog::writeValueInfo(log,(string *)local_ae0,&local_ac0,&local_aa0,local_a80);
  local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
  local_2a8.field_2._M_allocated_capacity._0_7_ = 0x43786574726556;
  local_2a8.field_2._7_4_ = 0x746e756f;
  local_2a8._M_string_length = 0xb;
  local_2a8.field_2._M_local_buf[0xb] = '\0';
  local_508._M_dataplus._M_p = (pointer)&local_508.field_2;
  local_838.m_name._M_dataplus._M_p = (pointer)0x12;
  local_508._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_508,(ulong)&local_838);
  local_508.field_2._M_allocated_capacity = (size_type)local_838.m_name._M_dataplus._M_p;
  builtin_strncpy(local_508._M_dataplus._M_p,"Number of vertices",0x12);
  local_508._M_string_length = (size_type)local_838.m_name._M_dataplus._M_p;
  local_508._M_dataplus._M_p[(long)local_838.m_name._M_dataplus._M_p] = '\0';
  local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
  local_2c8.field_2._M_allocated_capacity = 0x7365636974726576;
  local_2c8._M_string_length = 8;
  local_2c8.field_2._M_local_buf[8] = '\0';
  tcu::LogValueInfo::LogValueInfo
            ((LogValueInfo *)&local_a10,&local_2a8,&local_508,&local_2c8,
             QP_SAMPLE_VALUE_TAG_PREDICTOR);
  tcu::TestLog::writeValueInfo
            (log,&local_a10.m_name,&local_a10.m_desc,&local_a10.m_unit,local_a10.m_tag);
  local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
  local_2e8.field_2._M_allocated_capacity = 0x6461655277617244;
  local_2e8.field_2._8_4_ = 0x656d6954;
  local_2e8._M_string_length = 0xc;
  local_2e8.field_2._M_local_buf[0xc] = '\0';
  local_528._M_dataplus._M_p = (pointer)&local_528.field_2;
  local_8a0.m_name._M_dataplus._M_p = (pointer)0x24;
  local_528._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_528,(ulong)&local_8a0);
  local_528.field_2._M_allocated_capacity = (size_type)local_8a0.m_name._M_dataplus._M_p;
  builtin_strncpy(local_528._M_dataplus._M_p,"Second draw call and ReadPixels time",0x24);
  local_528._M_string_length = (size_type)local_8a0.m_name._M_dataplus._M_p;
  local_528._M_dataplus._M_p[(long)local_8a0.m_name._M_dataplus._M_p] = '\0';
  local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
  local_308.field_2._M_allocated_capacity._0_2_ = 0x7375;
  local_308._M_string_length = 2;
  local_308.field_2._M_local_buf[2] = '\0';
  tcu::LogValueInfo::LogValueInfo
            ((LogValueInfo *)&local_838,&local_2e8,&local_528,&local_308,
             QP_SAMPLE_VALUE_TAG_RESPONSE);
  tcu::TestLog::writeValueInfo
            (log,&local_838.m_name,&local_838.m_desc,&local_838.m_unit,local_838.m_tag);
  local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
  local_328.field_2._M_allocated_capacity = 0x6d69546c61746f54;
  local_328.field_2._8_2_ = 0x65;
  local_328._M_string_length = 9;
  local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
  local_348.field_2._M_allocated_capacity = 0x6974206c61746f54;
  local_348.field_2._8_2_ = 0x656d;
  local_348._M_string_length = 10;
  local_348.field_2._M_local_buf[10] = '\0';
  local_368._M_dataplus._M_p = (pointer)&local_368.field_2;
  local_368.field_2._M_allocated_capacity._0_2_ = 0x7375;
  local_368._M_string_length = 2;
  local_368.field_2._M_local_buf[2] = '\0';
  tcu::LogValueInfo::LogValueInfo
            ((LogValueInfo *)&local_8a0,&local_328,&local_348,&local_368,
             QP_SAMPLE_VALUE_TAG_RESPONSE);
  tcu::TestLog::writeValueInfo
            (log,&local_8a0.m_name,&local_8a0.m_desc,&local_8a0.m_unit,local_8a0.m_tag);
  local_748._M_dataplus._M_p = (pointer)&local_748.field_2;
  local_988.m_name._M_dataplus._M_p = (pointer)0x11;
  local_748._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_748,(ulong)&local_988);
  local_748.field_2._M_allocated_capacity = (size_type)local_988.m_name._M_dataplus._M_p;
  builtin_strncpy(local_748._M_dataplus._M_p,"FirstDrawCallTime",0x11);
  local_748._M_string_length = (size_type)local_988.m_name._M_dataplus._M_p;
  local_748._M_dataplus._M_p[(long)local_988.m_name._M_dataplus._M_p] = '\0';
  local_548._M_dataplus._M_p = (pointer)&local_548.field_2;
  local_988.m_name._M_dataplus._M_p = (pointer)0x14;
  local_548._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_548,(ulong)&local_988);
  local_548.field_2._M_allocated_capacity = (size_type)local_988.m_name._M_dataplus._M_p;
  builtin_strncpy(local_548._M_dataplus._M_p,"First draw call time",0x14);
  local_548._M_string_length = (size_type)local_988.m_name._M_dataplus._M_p;
  local_548._M_dataplus._M_p[(long)local_988.m_name._M_dataplus._M_p] = '\0';
  local_388._M_dataplus._M_p = (pointer)&local_388.field_2;
  local_388.field_2._M_allocated_capacity._0_2_ = 0x7375;
  local_388._M_string_length = 2;
  local_388.field_2._M_local_buf[2] = '\0';
  tcu::LogValueInfo::LogValueInfo
            ((LogValueInfo *)&local_5f0,&local_748,&local_548,&local_388,
             QP_SAMPLE_VALUE_TAG_RESPONSE);
  tcu::TestLog::writeValueInfo
            (log,&local_5f0.m_name,&local_5f0.m_desc,&local_5f0.m_unit,local_5f0.m_tag);
  local_3a8._M_dataplus._M_p = (pointer)&local_3a8.field_2;
  local_3a8.field_2._M_allocated_capacity._0_7_ = 0x2064616f6c7055;
  local_3a8.field_2._7_4_ = 0x656d6974;
  local_3a8._M_string_length = 0xb;
  local_3a8.field_2._M_local_buf[0xb] = '\0';
  local_3c8._M_dataplus._M_p = (pointer)&local_3c8.field_2;
  local_3c8.field_2._M_allocated_capacity._0_7_ = 0x2064616f6c7055;
  local_3c8.field_2._7_4_ = 0x656d6974;
  local_3c8._M_string_length = 0xb;
  local_3c8.field_2._M_local_buf[0xb] = '\0';
  local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
  local_3e8.field_2._M_allocated_capacity._0_2_ = 0x7375;
  local_3e8._M_string_length = 2;
  local_3e8.field_2._M_local_buf[2] = '\0';
  tcu::LogValueInfo::LogValueInfo
            ((LogValueInfo *)&local_988,&local_3a8,&local_3c8,&local_3e8,
             QP_SAMPLE_VALUE_TAG_RESPONSE);
  tcu::TestLog::writeValueInfo
            (log,&local_988.m_name,&local_988.m_desc,&local_988.m_unit,local_988.m_tag);
  local_768._M_dataplus._M_p = (pointer)&local_768.field_2;
  local_6c0.m_name._M_dataplus._M_p = (pointer)0x12;
  local_768._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_768,(ulong)&local_6c0);
  local_768.field_2._M_allocated_capacity = (size_type)local_6c0.m_name._M_dataplus._M_p;
  builtin_strncpy(local_768._M_dataplus._M_p,"SecondDrawCallTime",0x12);
  local_768._M_string_length = (size_type)local_6c0.m_name._M_dataplus._M_p;
  local_768._M_dataplus._M_p[(long)local_6c0.m_name._M_dataplus._M_p] = '\0';
  local_568._M_dataplus._M_p = (pointer)&local_568.field_2;
  local_6c0.m_name._M_dataplus._M_p = (pointer)0x15;
  local_568._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_568,(ulong)&local_6c0);
  local_568.field_2._M_allocated_capacity = (size_type)local_6c0.m_name._M_dataplus._M_p;
  builtin_strncpy(local_568._M_dataplus._M_p,"Second draw call time",0x15);
  local_568._M_string_length = (size_type)local_6c0.m_name._M_dataplus._M_p;
  local_568._M_dataplus._M_p[(long)local_6c0.m_name._M_dataplus._M_p] = '\0';
  local_408._M_dataplus._M_p = (pointer)&local_408.field_2;
  local_408.field_2._M_allocated_capacity._0_2_ = 0x7375;
  local_408._M_string_length = 2;
  local_408.field_2._M_local_buf[2] = '\0';
  tcu::LogValueInfo::LogValueInfo
            ((LogValueInfo *)&local_7d0,&local_768,&local_568,&local_408,
             QP_SAMPLE_VALUE_TAG_RESPONSE);
  tcu::TestLog::writeValueInfo
            (log,&local_7d0.m_name,&local_7d0.m_desc,&local_7d0.m_unit,local_7d0.m_tag);
  local_428._M_dataplus._M_p = (pointer)&local_428.field_2;
  local_428.field_2._M_allocated_capacity = 0x656d695464616552;
  local_428._M_string_length = 8;
  local_428.field_2._M_local_buf[8] = '\0';
  local_448._M_dataplus._M_p = (pointer)&local_448.field_2;
  local_448.field_2._M_allocated_capacity._0_7_ = 0x78695064616552;
  local_448.field_2._M_local_buf[7] = 'e';
  local_448.field_2._8_7_ = 0x656d697420736c;
  local_448._M_string_length = 0xf;
  local_448.field_2._M_local_buf[0xf] = '\0';
  local_468._M_dataplus._M_p = (pointer)&local_468.field_2;
  local_468.field_2._M_allocated_capacity._0_2_ = 0x7375;
  local_468._M_string_length = 2;
  local_468.field_2._M_local_buf[2] = '\0';
  tcu::LogValueInfo::LogValueInfo
            ((LogValueInfo *)&local_6c0,&local_428,&local_448,&local_468,
             QP_SAMPLE_VALUE_TAG_RESPONSE);
  tcu::TestLog::writeValueInfo
            (log,&local_6c0.m_name,&local_6c0.m_desc,&local_6c0.m_unit,local_6c0.m_tag);
  local_488._M_dataplus._M_p = (pointer)&local_488.field_2;
  local_488.field_2._M_allocated_capacity._0_7_ = 0x69736552746946;
  local_488.field_2._7_4_ = 0x6c617564;
  local_488._M_string_length = 0xb;
  local_488.field_2._M_local_buf[0xb] = '\0';
  local_4a8._M_dataplus._M_p = (pointer)&local_4a8.field_2;
  local_4a8.field_2._M_allocated_capacity = 0x6973657220746946;
  local_4a8.field_2._8_4_ = 0x6c617564;
  local_4a8._M_string_length = 0xc;
  local_4a8.field_2._M_local_buf[0xc] = '\0';
  local_4c8._M_dataplus._M_p = (pointer)&local_4c8.field_2;
  local_4c8.field_2._M_allocated_capacity._0_2_ = 0x7375;
  local_4c8._M_string_length = 2;
  local_4c8.field_2._M_local_buf[2] = '\0';
  tcu::LogValueInfo::LogValueInfo
            ((LogValueInfo *)&local_920,&local_488,&local_4a8,&local_4c8,
             QP_SAMPLE_VALUE_TAG_RESPONSE);
  tcu::TestLog::writeValueInfo
            (log,&local_920.m_name,&local_920.m_desc,&local_920.m_unit,local_920.m_tag);
  tcu::TestLog::endSampleInfo(log);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_920.m_unit._M_dataplus._M_p != &local_920.m_unit.field_2) {
    operator_delete(local_920.m_unit._M_dataplus._M_p,
                    local_920.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_920.m_desc._M_dataplus._M_p != &local_920.m_desc.field_2) {
    operator_delete(local_920.m_desc._M_dataplus._M_p,
                    local_920.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_920.m_name._M_dataplus._M_p != &local_920.m_name.field_2) {
    operator_delete(local_920.m_name._M_dataplus._M_p,
                    CONCAT17(local_920.m_name.field_2._M_local_buf[7],
                             CONCAT16(local_920.m_name.field_2._M_local_buf[6],
                                      local_920.m_name.field_2._M_allocated_capacity._0_6_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c8._M_dataplus._M_p != &local_4c8.field_2) {
    operator_delete(local_4c8._M_dataplus._M_p,
                    CONCAT53(local_4c8.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_4c8.field_2._M_local_buf[2],
                                      local_4c8.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4a8._M_dataplus._M_p != &local_4a8.field_2) {
    operator_delete(local_4a8._M_dataplus._M_p,local_4a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_488._M_dataplus._M_p != &local_488.field_2) {
    operator_delete(local_488._M_dataplus._M_p,
                    CONCAT17(local_488.field_2._M_local_buf[7],
                             local_488.field_2._M_allocated_capacity._0_7_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6c0.m_unit._M_dataplus._M_p != &local_6c0.m_unit.field_2) {
    operator_delete(local_6c0.m_unit._M_dataplus._M_p,
                    local_6c0.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6c0.m_desc._M_dataplus._M_p != &local_6c0.m_desc.field_2) {
    operator_delete(local_6c0.m_desc._M_dataplus._M_p,
                    local_6c0.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6c0.m_name._M_dataplus._M_p != &local_6c0.m_name.field_2) {
    operator_delete(local_6c0.m_name._M_dataplus._M_p,
                    CONCAT44(local_6c0.m_name.field_2._M_allocated_capacity._4_4_,
                             local_6c0.m_name.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_468._M_dataplus._M_p != &local_468.field_2) {
    operator_delete(local_468._M_dataplus._M_p,
                    CONCAT53(local_468.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_468.field_2._M_local_buf[2],
                                      local_468.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_448._M_dataplus._M_p != &local_448.field_2) {
    operator_delete(local_448._M_dataplus._M_p,
                    CONCAT17(local_448.field_2._M_local_buf[7],
                             local_448.field_2._M_allocated_capacity._0_7_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_428._M_dataplus._M_p != &local_428.field_2) {
    operator_delete(local_428._M_dataplus._M_p,local_428.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7d0.m_unit._M_dataplus._M_p != &local_7d0.m_unit.field_2) {
    operator_delete(local_7d0.m_unit._M_dataplus._M_p,
                    local_7d0.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7d0.m_desc._M_dataplus._M_p != &local_7d0.m_desc.field_2) {
    operator_delete(local_7d0.m_desc._M_dataplus._M_p,
                    local_7d0.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7d0.m_name._M_dataplus._M_p != &local_7d0.m_name.field_2) {
    operator_delete(local_7d0.m_name._M_dataplus._M_p,
                    local_7d0.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_408._M_dataplus._M_p != &local_408.field_2) {
    operator_delete(local_408._M_dataplus._M_p,
                    CONCAT53(local_408.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_408.field_2._M_local_buf[2],
                                      local_408.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_568._M_dataplus._M_p != &local_568.field_2) {
    operator_delete(local_568._M_dataplus._M_p,(ulong)(local_568.field_2._M_allocated_capacity + 1))
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_768._M_dataplus._M_p != &local_768.field_2) {
    operator_delete(local_768._M_dataplus._M_p,(ulong)(local_768.field_2._M_allocated_capacity + 1))
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_988.m_unit._M_dataplus._M_p != &local_988.m_unit.field_2) {
    operator_delete(local_988.m_unit._M_dataplus._M_p,
                    local_988.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_988.m_desc._M_dataplus._M_p != &local_988.m_desc.field_2) {
    operator_delete(local_988.m_desc._M_dataplus._M_p,
                    local_988.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_988.m_name._M_dataplus._M_p != &local_988.m_name.field_2) {
    operator_delete(local_988.m_name._M_dataplus._M_p,
                    CONCAT17(local_988.m_name.field_2._M_local_buf[7],
                             CONCAT16(local_988.m_name.field_2._M_local_buf[6],
                                      local_988.m_name.field_2._M_allocated_capacity._0_6_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
    operator_delete(local_3e8._M_dataplus._M_p,
                    CONCAT53(local_3e8.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_3e8.field_2._M_local_buf[2],
                                      local_3e8.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
    operator_delete(local_3c8._M_dataplus._M_p,
                    CONCAT17(local_3c8.field_2._M_local_buf[7],
                             local_3c8.field_2._M_allocated_capacity._0_7_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
    operator_delete(local_3a8._M_dataplus._M_p,
                    CONCAT17(local_3a8.field_2._M_local_buf[7],
                             local_3a8.field_2._M_allocated_capacity._0_7_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5f0.m_unit._M_dataplus._M_p != &local_5f0.m_unit.field_2) {
    operator_delete(local_5f0.m_unit._M_dataplus._M_p,
                    local_5f0.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5f0.m_desc._M_dataplus._M_p != &local_5f0.m_desc.field_2) {
    operator_delete(local_5f0.m_desc._M_dataplus._M_p,
                    local_5f0.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5f0.m_name._M_dataplus._M_p != &local_5f0.m_name.field_2) {
    operator_delete(local_5f0.m_name._M_dataplus._M_p,
                    CONCAT53(local_5f0.m_name.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_5f0.m_name.field_2._M_local_buf[2],
                                      local_5f0.m_name.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_388._M_dataplus._M_p != &local_388.field_2) {
    operator_delete(local_388._M_dataplus._M_p,
                    CONCAT53(local_388.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_388.field_2._M_local_buf[2],
                                      local_388.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_548._M_dataplus._M_p != &local_548.field_2) {
    operator_delete(local_548._M_dataplus._M_p,(ulong)(local_548.field_2._M_allocated_capacity + 1))
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_748._M_dataplus._M_p != &local_748.field_2) {
    operator_delete(local_748._M_dataplus._M_p,(ulong)(local_748.field_2._M_allocated_capacity + 1))
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8a0.m_unit._M_dataplus._M_p != &local_8a0.m_unit.field_2) {
    operator_delete(local_8a0.m_unit._M_dataplus._M_p,
                    local_8a0.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8a0.m_desc._M_dataplus._M_p != &local_8a0.m_desc.field_2) {
    operator_delete(local_8a0.m_desc._M_dataplus._M_p,
                    local_8a0.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8a0.m_name._M_dataplus._M_p != &local_8a0.m_name.field_2) {
    operator_delete(local_8a0.m_name._M_dataplus._M_p,
                    local_8a0.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368._M_dataplus._M_p != &local_368.field_2) {
    operator_delete(local_368._M_dataplus._M_p,
                    CONCAT53(local_368.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_368.field_2._M_local_buf[2],
                                      local_368.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_348._M_dataplus._M_p != &local_348.field_2) {
    operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_328._M_dataplus._M_p != &local_328.field_2) {
    operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_838.m_unit._M_dataplus._M_p != &local_838.m_unit.field_2) {
    operator_delete(local_838.m_unit._M_dataplus._M_p,
                    local_838.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_838.m_desc._M_dataplus._M_p != &local_838.m_desc.field_2) {
    operator_delete(local_838.m_desc._M_dataplus._M_p,
                    local_838.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_838.m_name._M_dataplus._M_p != &local_838.m_name.field_2) {
    operator_delete(local_838.m_name._M_dataplus._M_p,
                    local_838.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_308._M_dataplus._M_p != &local_308.field_2) {
    operator_delete(local_308._M_dataplus._M_p,
                    CONCAT53(local_308.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_308.field_2._M_local_buf[2],
                                      local_308.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_528._M_dataplus._M_p != &local_528.field_2) {
    operator_delete(local_528._M_dataplus._M_p,(ulong)(local_528.field_2._M_allocated_capacity + 1))
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
    operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a10.m_unit._M_dataplus._M_p != &local_a10.m_unit.field_2) {
    operator_delete(local_a10.m_unit._M_dataplus._M_p,
                    local_a10.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a10.m_desc._M_dataplus._M_p != &local_a10.m_desc.field_2) {
    operator_delete(local_a10.m_desc._M_dataplus._M_p,
                    local_a10.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a10.m_name._M_dataplus._M_p != &local_a10.m_name.field_2) {
    operator_delete(local_a10.m_name._M_dataplus._M_p,
                    local_a10.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
    operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_508._M_dataplus._M_p != &local_508.field_2) {
    operator_delete(local_508._M_dataplus._M_p,(ulong)(local_508.field_2._M_allocated_capacity + 1))
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
    operator_delete(local_2a8._M_dataplus._M_p,
                    CONCAT17(local_2a8.field_2._M_local_buf[7],
                             local_2a8.field_2._M_allocated_capacity._0_7_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_aa0._M_dataplus._M_p != &local_aa0.field_2) {
    operator_delete(local_aa0._M_dataplus._M_p,local_aa0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ac0._M_dataplus._M_p != &local_ac0.field_2) {
    operator_delete(local_ac0._M_dataplus._M_p,local_ac0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ae0._0_8_ != &local_ad0) {
    operator_delete((void *)local_ae0._0_8_,local_ad0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p != &local_288.field_2) {
    operator_delete(local_288._M_dataplus._M_p,
                    CONCAT26(local_288.field_2._M_allocated_capacity._6_2_,
                             CONCAT24(local_288.field_2._M_allocated_capacity._4_2_,
                                      local_288.field_2._M_allocated_capacity._0_4_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != &local_268.field_2) {
    operator_delete(local_268._M_dataplus._M_p,
                    CONCAT35(local_268.field_2._M_allocated_capacity._5_3_,
                             local_268.field_2._M_allocated_capacity._0_5_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != &local_248.field_2) {
    operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a38._M_dataplus._M_p != &local_a38.field_2) {
    operator_delete(local_a38._M_dataplus._M_p,local_a38.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a58._M_dataplus._M_p != &local_a58.field_2) {
    operator_delete(local_a58._M_dataplus._M_p,local_a58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a78._0_8_ != &aStack_a68) {
    operator_delete((void *)local_a78._0_8_,aStack_a68._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != &local_228.field_2) {
    operator_delete(local_228._M_dataplus._M_p,
                    CONCAT26(local_228.field_2._M_allocated_capacity._6_2_,
                             CONCAT24(local_228.field_2._M_allocated_capacity._4_2_,
                                      local_228.field_2._M_allocated_capacity._0_4_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p,
                    CONCAT26(local_208.field_2._M_allocated_capacity._6_2_,
                             local_208.field_2._M_allocated_capacity._0_6_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_588._M_dataplus._M_p != &local_588.field_2) {
    operator_delete(local_588._M_dataplus._M_p,local_588.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_728.m_desc._M_dataplus._M_p != &local_728.m_desc.field_2) {
    operator_delete(local_728.m_desc._M_dataplus._M_p,
                    local_728.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_728.m_name._M_dataplus._M_p != &local_728.m_name.field_2) {
    operator_delete(local_728.m_name._M_dataplus._M_p,
                    local_728.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9a8._0_8_ != &local_998) {
    operator_delete((void *)local_9a8._0_8_,
                    CONCAT44(local_998._M_allocated_capacity._4_4_,
                             local_998._M_allocated_capacity._0_4_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_658.m_name._M_dataplus._M_p != &local_658.m_name.field_2) {
    operator_delete(local_658.m_name._M_dataplus._M_p,
                    CONCAT17(local_658.m_name.field_2._M_local_buf[7],
                             CONCAT43(local_658.m_name.field_2._M_allocated_capacity._3_4_,
                                      CONCAT12(local_658.m_name.field_2._M_local_buf[2],
                                               local_658.m_name.field_2._M_allocated_capacity._0_2_)
                                     )) + 1);
  }
  pRVar8 = (samples->
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(samples->
                              super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)pRVar8) >> 3) *
          0x38e38e39) {
    lVar13 = 0;
    lVar11 = 0;
    do {
      uVar12 = *(ulong *)((long)&(pRVar8->duration).fitResponseDuration + lVar13);
      local_8b8._0_4_ =
           (float)*(int *)((long)&pRVar8->renderDataSize + lVar13) * local_4e4.coefficient +
           local_4e4.offset;
      local_a78._8_8_ = (pointer)0x0;
      aStack_a68._M_allocated_capacity = 0;
      aStack_a68._8_8_ = 0;
      local_a78._0_8_ = log;
      pSVar9 = tcu::SampleBuilder::operator<<
                         ((SampleBuilder *)local_a78,
                          *(int *)((long)&pRVar8->renderDataSize + lVar13));
      pSVar9 = tcu::SampleBuilder::operator<<
                         (pSVar9,*(int *)((long)&((samples->
                                                  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)->
                                                 uploadedDataSize + lVar13));
      pSVar9 = tcu::SampleBuilder::operator<<
                         (pSVar9,*(int *)((long)&((samples->
                                                  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)->
                                                 numVertices + lVar13));
      pSVar9 = tcu::SampleBuilder::operator<<
                         (pSVar9,*(int *)((long)&(((samples->
                                                                                                      
                                                  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)->
                                                 duration).renderReadDuration + lVar13));
      pSVar9 = tcu::SampleBuilder::operator<<
                         (pSVar9,*(int *)((long)&(((samples->
                                                                                                      
                                                  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)->
                                                 duration).totalDuration + lVar13));
      pSVar9 = tcu::SampleBuilder::operator<<
                         (pSVar9,*(int *)((long)&(((samples->
                                                                                                      
                                                  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)->
                                                 duration).firstRenderDuration + lVar13));
      pSVar9 = tcu::SampleBuilder::operator<<
                         (pSVar9,*(int *)((long)&(((samples->
                                                                                                      
                                                  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)->
                                                 duration).uploadDuration + lVar13));
      pSVar9 = tcu::SampleBuilder::operator<<
                         (pSVar9,*(int *)((long)&(((samples->
                                                                                                      
                                                  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)->
                                                 duration).secondRenderDuration + lVar13));
      pSVar9 = tcu::SampleBuilder::operator<<
                         (pSVar9,*(int *)((long)&(((samples->
                                                                                                      
                                                  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)->
                                                 duration).readDuration + lVar13));
      pSVar9 = tcu::SampleBuilder::operator<<(pSVar9,(float)uVar12 - (float)local_8b8._0_4_);
      tcu::SampleBuilder::operator<<(pSVar9,(EndSampleToken *)&tcu::TestLog::EndSample);
      if ((pointer)local_a78._8_8_ != (pointer)0x0) {
        operator_delete((void *)local_a78._8_8_,aStack_a68._8_8_ - local_a78._8_8_);
      }
      lVar11 = lVar11 + 1;
      pRVar8 = (samples->
               super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      lVar13 = lVar13 + 0x48;
    } while (lVar11 < (int)((ulong)((long)(samples->
                                          super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
                                          )._M_impl.super__Vector_impl_data._M_finish - (long)pRVar8
                                   ) >> 3) * 0x38e38e39);
  }
  tcu::TestLog::endSampleList(log);
  tcu::TestLog::endSection((TestLog *)local_1b0._M_dataplus._M_p);
  local_a78._0_8_ = &aStack_a68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a78,"Contribution","");
  local_ae0._0_8_ = &local_ad0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_ae0,"Contributions","");
  tcu::ScopedLogSection::ScopedLogSection
            ((ScopedLogSection *)&local_588,log,(string *)local_a78,(string *)local_ae0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ae0._0_8_ != &local_ad0) {
    operator_delete((void *)local_ae0._0_8_,local_ad0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a78._0_8_ != &aStack_a68) {
    operator_delete((void *)local_a78._0_8_,aStack_a68._M_allocated_capacity + 1);
  }
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>
            ((LineParametersWithConfidence *)local_9a8,samples,0,
             (int)((ulong)((long)(samples->
                                 super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(samples->
                                super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
                                )._M_impl.super__Vector_impl_data._M_start) >> 3) * 0x38e38e39,1,0);
  local_838.m_name._M_dataplus._M_p = (pointer)&local_838.m_name.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_838,"FirstDrawCallConstantCost","");
  local_8a0.m_name._M_dataplus._M_p = (pointer)&local_8a0.m_name.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_8a0,"First DrawCall: Approximated contant cost","");
  local_5f0.m_name._M_dataplus._M_p = (pointer)&local_5f0.m_name.field_2;
  local_5f0.m_name.field_2._M_allocated_capacity._0_2_ = 0x7375;
  local_5f0.m_name._M_string_length = 2;
  local_5f0.m_name.field_2._M_local_buf[2] = '\0';
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)local_a78,&local_838.m_name,&local_8a0.m_name,&local_5f0.m_name,
             QP_KEY_TAG_TIME,(float)local_9a8._0_4_);
  tcu::TestLog::writeFloat
            (log,(char *)local_a78._0_8_,local_a58._M_dataplus._M_p,local_a38._M_dataplus._M_p,
             local_a18,local_a14);
  local_988.m_name._M_dataplus._M_p = (pointer)&local_988.m_name.field_2;
  local_a10.m_name._M_dataplus._M_p = (pointer)0x17;
  local_988.m_name._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_988,(ulong)&local_a10);
  local_988.m_name.field_2._M_allocated_capacity._0_6_ = SUB86(local_a10.m_name._M_dataplus._M_p,0);
  local_988.m_name.field_2._M_local_buf[6] =
       (char)((ulong)local_a10.m_name._M_dataplus._M_p >> 0x30);
  local_988.m_name.field_2._M_local_buf[7] =
       (char)((ulong)local_a10.m_name._M_dataplus._M_p >> 0x38);
  builtin_strncpy(local_988.m_name._M_dataplus._M_p,"FirstDrawCallLinearCost",0x17);
  local_988.m_name._M_string_length = (size_type)local_a10.m_name._M_dataplus._M_p;
  local_988.m_name._M_dataplus._M_p[(long)local_a10.m_name._M_dataplus._M_p] = '\0';
  local_7d0.m_name._M_dataplus._M_p = (pointer)&local_7d0.m_name.field_2;
  local_a10.m_name._M_dataplus._M_p = (char *)0x28;
  local_7d0.m_name._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_7d0,(ulong)&local_a10);
  local_7d0.m_name.field_2._M_allocated_capacity = (size_type)local_a10.m_name._M_dataplus._M_p;
  builtin_strncpy(local_7d0.m_name._M_dataplus._M_p,"First DrawCall: Approximated linear cost",0x28)
  ;
  local_7d0.m_name._M_string_length = (size_type)local_a10.m_name._M_dataplus._M_p;
  local_7d0.m_name._M_dataplus._M_p[(long)local_a10.m_name._M_dataplus._M_p] = '\0';
  local_6c0.m_name._M_dataplus._M_p = (pointer)&local_6c0.m_name.field_2;
  local_6c0.m_name.field_2._M_allocated_capacity._0_4_ = 0x2f207375;
  local_6c0.m_name._M_string_length = 7;
  local_6c0.m_name.field_2._M_allocated_capacity._4_4_ = 0x424d20;
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)local_ae0,&local_988.m_name,&local_7d0.m_name,&local_6c0.m_name,
             QP_KEY_TAG_TIME,(float)local_9a8._12_4_ * 1024.0 * 1024.0);
  tcu::TestLog::writeFloat
            (log,(char *)local_ae0._0_8_,local_ac0._M_dataplus._M_p,local_aa0._M_dataplus._M_p,
             local_a80,local_a7c);
  local_920.m_name._M_dataplus._M_p = (pointer)&local_920.m_name.field_2;
  local_728.m_name._M_dataplus._M_p = (pointer)0x17;
  local_920.m_name._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_920,(ulong)&local_728);
  local_920.m_name.field_2._M_allocated_capacity._0_6_ = SUB86(local_728.m_name._M_dataplus._M_p,0);
  local_920.m_name.field_2._M_local_buf[6] =
       (char)((ulong)local_728.m_name._M_dataplus._M_p >> 0x30);
  local_920.m_name.field_2._M_local_buf[7] =
       (char)((ulong)local_728.m_name._M_dataplus._M_p >> 0x38);
  builtin_strncpy(local_920.m_name._M_dataplus._M_p,"FirstDrawCallMedianCost",0x17);
  local_920.m_name._M_string_length = (size_type)local_728.m_name._M_dataplus._M_p;
  local_920.m_name._M_dataplus._M_p[(long)local_728.m_name._M_dataplus._M_p] = '\0';
  local_728.m_name._M_dataplus._M_p = (pointer)&local_728.m_name.field_2;
  local_658.m_name._M_dataplus._M_p = (pointer)0x1b;
  local_728.m_name._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_728,(ulong)&local_658);
  local_728.m_name.field_2._M_allocated_capacity = (size_type)local_658.m_name._M_dataplus._M_p;
  builtin_strncpy(local_728.m_name._M_dataplus._M_p,"First DrawCall: Median cost",0x1b);
  local_728.m_name._M_string_length = (size_type)local_658.m_name._M_dataplus._M_p;
  local_728.m_name._M_dataplus._M_p[(long)local_658.m_name._M_dataplus._M_p] = '\0';
  local_658.m_name._M_dataplus._M_p = (pointer)&local_658.m_name.field_2;
  local_658.m_name.field_2._M_allocated_capacity._0_2_ = 0x7375;
  local_658.m_name._M_string_length = 2;
  local_658.m_name.field_2._M_local_buf[2] = '\0';
  tcu::LogNumber<float>::LogNumber
            (&local_a10,&local_920.m_name,&local_728.m_name,&local_658.m_name,QP_KEY_TAG_TIME,
             local_10c.medianTime);
  tcu::TestLog::writeFloat
            (log,local_a10.m_name._M_dataplus._M_p,local_a10.m_desc._M_dataplus._M_p,
             local_a10.m_unit._M_dataplus._M_p,local_a10.m_tag,local_a10.m_value);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a10.m_unit._M_dataplus._M_p != &local_a10.m_unit.field_2) {
    operator_delete(local_a10.m_unit._M_dataplus._M_p,
                    local_a10.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a10.m_desc._M_dataplus._M_p != &local_a10.m_desc.field_2) {
    operator_delete(local_a10.m_desc._M_dataplus._M_p,
                    local_a10.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a10.m_name._M_dataplus._M_p != &local_a10.m_name.field_2) {
    operator_delete(local_a10.m_name._M_dataplus._M_p,
                    local_a10.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_658.m_name._M_dataplus._M_p != &local_658.m_name.field_2) {
    operator_delete(local_658.m_name._M_dataplus._M_p,
                    CONCAT17(local_658.m_name.field_2._M_local_buf[7],
                             CONCAT43(local_658.m_name.field_2._M_allocated_capacity._3_4_,
                                      CONCAT12(local_658.m_name.field_2._M_local_buf[2],
                                               local_658.m_name.field_2._M_allocated_capacity._0_2_)
                                     )) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_728.m_name._M_dataplus._M_p != &local_728.m_name.field_2) {
    operator_delete(local_728.m_name._M_dataplus._M_p,
                    local_728.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_920.m_name._M_dataplus._M_p != &local_920.m_name.field_2) {
    operator_delete(local_920.m_name._M_dataplus._M_p,
                    CONCAT17(local_920.m_name.field_2._M_local_buf[7],
                             CONCAT16(local_920.m_name.field_2._M_local_buf[6],
                                      local_920.m_name.field_2._M_allocated_capacity._0_6_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_aa0._M_dataplus._M_p != &local_aa0.field_2) {
    operator_delete(local_aa0._M_dataplus._M_p,local_aa0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ac0._M_dataplus._M_p != &local_ac0.field_2) {
    operator_delete(local_ac0._M_dataplus._M_p,local_ac0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ae0._0_8_ != &local_ad0) {
    operator_delete((void *)local_ae0._0_8_,local_ad0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6c0.m_name._M_dataplus._M_p != &local_6c0.m_name.field_2) {
    operator_delete(local_6c0.m_name._M_dataplus._M_p,
                    CONCAT44(local_6c0.m_name.field_2._M_allocated_capacity._4_4_,
                             local_6c0.m_name.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7d0.m_name._M_dataplus._M_p != &local_7d0.m_name.field_2) {
    operator_delete(local_7d0.m_name._M_dataplus._M_p,
                    (ulong)(local_7d0.m_name.field_2._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_988.m_name._M_dataplus._M_p != &local_988.m_name.field_2) {
    operator_delete(local_988.m_name._M_dataplus._M_p,
                    CONCAT17(local_988.m_name.field_2._M_local_buf[7],
                             CONCAT16(local_988.m_name.field_2._M_local_buf[6],
                                      local_988.m_name.field_2._M_allocated_capacity._0_6_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a38._M_dataplus._M_p != &local_a38.field_2) {
    operator_delete(local_a38._M_dataplus._M_p,local_a38.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a58._M_dataplus._M_p != &local_a58.field_2) {
    operator_delete(local_a58._M_dataplus._M_p,local_a58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a78._0_8_ != &aStack_a68) {
    operator_delete((void *)local_a78._0_8_,aStack_a68._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5f0.m_name._M_dataplus._M_p != &local_5f0.m_name.field_2) {
    operator_delete(local_5f0.m_name._M_dataplus._M_p,
                    CONCAT53(local_5f0.m_name.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_5f0.m_name.field_2._M_local_buf[2],
                                      local_5f0.m_name.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8a0.m_name._M_dataplus._M_p != &local_8a0.m_name.field_2) {
    operator_delete(local_8a0.m_name._M_dataplus._M_p,
                    local_8a0.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_838.m_name._M_dataplus._M_p != &local_838.m_name.field_2) {
    operator_delete(local_838.m_name._M_dataplus._M_p,
                    local_838.m_name.field_2._M_allocated_capacity + 1);
  }
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>
            ((LineParametersWithConfidence *)local_9a8,samples,0,
             (int)((ulong)((long)(samples->
                                 super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(samples->
                                super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
                                )._M_impl.super__Vector_impl_data._M_start) >> 3) * 0x38e38e39,1,8);
  local_838.m_name._M_dataplus._M_p = (pointer)&local_838.m_name.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_838,"UploadConstantCost","");
  local_8a0.m_name._M_dataplus._M_p = (pointer)&local_8a0.m_name.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_8a0,"Upload: Approximated contant cost","");
  local_5f0.m_name._M_dataplus._M_p = (pointer)&local_5f0.m_name.field_2;
  local_5f0.m_name.field_2._M_allocated_capacity._0_2_ = 0x7375;
  local_5f0.m_name._M_string_length = 2;
  local_5f0.m_name.field_2._M_local_buf[2] = '\0';
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)local_a78,&local_838.m_name,&local_8a0.m_name,&local_5f0.m_name,
             QP_KEY_TAG_TIME,(float)local_9a8._0_4_);
  tcu::TestLog::writeFloat
            (log,(char *)local_a78._0_8_,local_a58._M_dataplus._M_p,local_a38._M_dataplus._M_p,
             local_a18,local_a14);
  local_988.m_name._M_dataplus._M_p = (pointer)&local_988.m_name.field_2;
  local_a10.m_name._M_dataplus._M_p = (pointer)0x10;
  local_988.m_name._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_988,(ulong)&local_a10);
  local_988.m_name.field_2._M_allocated_capacity._0_6_ = SUB86(local_a10.m_name._M_dataplus._M_p,0);
  local_988.m_name.field_2._M_local_buf[6] =
       (char)((ulong)local_a10.m_name._M_dataplus._M_p >> 0x30);
  local_988.m_name.field_2._M_local_buf[7] =
       (char)((ulong)local_a10.m_name._M_dataplus._M_p >> 0x38);
  builtin_strncpy(local_988.m_name._M_dataplus._M_p,"UploadLinearCost",0x10);
  local_988.m_name._M_string_length = (size_type)local_a10.m_name._M_dataplus._M_p;
  local_988.m_name._M_dataplus._M_p[(long)local_a10.m_name._M_dataplus._M_p] = '\0';
  local_7d0.m_name._M_dataplus._M_p = (pointer)&local_7d0.m_name.field_2;
  local_a10.m_name._M_dataplus._M_p = (char *)0x20;
  local_7d0.m_name._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_7d0,(ulong)&local_a10);
  local_7d0.m_name.field_2._M_allocated_capacity = (size_type)local_a10.m_name._M_dataplus._M_p;
  builtin_strncpy(local_7d0.m_name._M_dataplus._M_p,"Upload: Approximated linear cost",0x20);
  local_7d0.m_name._M_string_length = (size_type)local_a10.m_name._M_dataplus._M_p;
  local_7d0.m_name._M_dataplus._M_p[(long)local_a10.m_name._M_dataplus._M_p] = '\0';
  local_6c0.m_name._M_dataplus._M_p = (pointer)&local_6c0.m_name.field_2;
  local_6c0.m_name.field_2._M_allocated_capacity._0_4_ = 0x2f207375;
  local_6c0.m_name._M_string_length = 7;
  local_6c0.m_name.field_2._M_allocated_capacity._4_4_ = 0x424d20;
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)local_ae0,&local_988.m_name,&local_7d0.m_name,&local_6c0.m_name,
             QP_KEY_TAG_TIME,(float)local_9a8._12_4_ * 1024.0 * 1024.0);
  tcu::TestLog::writeFloat
            (log,(char *)local_ae0._0_8_,local_ac0._M_dataplus._M_p,local_aa0._M_dataplus._M_p,
             local_a80,local_a7c);
  local_920.m_name._M_dataplus._M_p = (pointer)&local_920.m_name.field_2;
  local_728.m_name._M_dataplus._M_p = (pointer)0x10;
  local_920.m_name._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_920,(ulong)&local_728);
  local_920.m_name.field_2._M_allocated_capacity._0_6_ = SUB86(local_728.m_name._M_dataplus._M_p,0);
  local_920.m_name.field_2._M_local_buf[6] =
       (char)((ulong)local_728.m_name._M_dataplus._M_p >> 0x30);
  local_920.m_name.field_2._M_local_buf[7] =
       (char)((ulong)local_728.m_name._M_dataplus._M_p >> 0x38);
  builtin_strncpy(local_920.m_name._M_dataplus._M_p,"UploadMedianCost",0x10);
  local_920.m_name._M_string_length = (size_type)local_728.m_name._M_dataplus._M_p;
  local_920.m_name._M_dataplus._M_p[(long)local_728.m_name._M_dataplus._M_p] = '\0';
  local_728.m_name._M_dataplus._M_p = (pointer)&local_728.m_name.field_2;
  local_658.m_name._M_dataplus._M_p = (pointer)0x13;
  local_728.m_name._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_728,(ulong)&local_658);
  local_728.m_name.field_2._M_allocated_capacity = (size_type)local_658.m_name._M_dataplus._M_p;
  builtin_strncpy(local_728.m_name._M_dataplus._M_p,"Upload: Median cost",0x13);
  local_728.m_name._M_string_length = (size_type)local_658.m_name._M_dataplus._M_p;
  local_728.m_name._M_dataplus._M_p[(long)local_658.m_name._M_dataplus._M_p] = '\0';
  local_658.m_name._M_dataplus._M_p = (pointer)&local_658.m_name.field_2;
  local_658.m_name.field_2._M_allocated_capacity._0_2_ = 0x7375;
  local_658.m_name._M_string_length = 2;
  local_658.m_name.field_2._M_local_buf[2] = '\0';
  tcu::LogNumber<float>::LogNumber
            (&local_a10,&local_920.m_name,&local_728.m_name,&local_658.m_name,QP_KEY_TAG_TIME,
             local_f8.medianTime);
  tcu::TestLog::writeFloat
            (log,local_a10.m_name._M_dataplus._M_p,local_a10.m_desc._M_dataplus._M_p,
             local_a10.m_unit._M_dataplus._M_p,local_a10.m_tag,local_a10.m_value);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a10.m_unit._M_dataplus._M_p != &local_a10.m_unit.field_2) {
    operator_delete(local_a10.m_unit._M_dataplus._M_p,
                    local_a10.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a10.m_desc._M_dataplus._M_p != &local_a10.m_desc.field_2) {
    operator_delete(local_a10.m_desc._M_dataplus._M_p,
                    local_a10.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a10.m_name._M_dataplus._M_p != &local_a10.m_name.field_2) {
    operator_delete(local_a10.m_name._M_dataplus._M_p,
                    local_a10.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_658.m_name._M_dataplus._M_p != &local_658.m_name.field_2) {
    operator_delete(local_658.m_name._M_dataplus._M_p,
                    CONCAT17(local_658.m_name.field_2._M_local_buf[7],
                             CONCAT43(local_658.m_name.field_2._M_allocated_capacity._3_4_,
                                      CONCAT12(local_658.m_name.field_2._M_local_buf[2],
                                               local_658.m_name.field_2._M_allocated_capacity._0_2_)
                                     )) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_728.m_name._M_dataplus._M_p != &local_728.m_name.field_2) {
    operator_delete(local_728.m_name._M_dataplus._M_p,
                    local_728.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_920.m_name._M_dataplus._M_p != &local_920.m_name.field_2) {
    operator_delete(local_920.m_name._M_dataplus._M_p,
                    CONCAT17(local_920.m_name.field_2._M_local_buf[7],
                             CONCAT16(local_920.m_name.field_2._M_local_buf[6],
                                      local_920.m_name.field_2._M_allocated_capacity._0_6_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_aa0._M_dataplus._M_p != &local_aa0.field_2) {
    operator_delete(local_aa0._M_dataplus._M_p,local_aa0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ac0._M_dataplus._M_p != &local_ac0.field_2) {
    operator_delete(local_ac0._M_dataplus._M_p,local_ac0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ae0._0_8_ != &local_ad0) {
    operator_delete((void *)local_ae0._0_8_,local_ad0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6c0.m_name._M_dataplus._M_p != &local_6c0.m_name.field_2) {
    operator_delete(local_6c0.m_name._M_dataplus._M_p,
                    CONCAT44(local_6c0.m_name.field_2._M_allocated_capacity._4_4_,
                             local_6c0.m_name.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7d0.m_name._M_dataplus._M_p != &local_7d0.m_name.field_2) {
    operator_delete(local_7d0.m_name._M_dataplus._M_p,
                    (ulong)(local_7d0.m_name.field_2._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_988.m_name._M_dataplus._M_p != &local_988.m_name.field_2) {
    operator_delete(local_988.m_name._M_dataplus._M_p,
                    CONCAT17(local_988.m_name.field_2._M_local_buf[7],
                             CONCAT16(local_988.m_name.field_2._M_local_buf[6],
                                      local_988.m_name.field_2._M_allocated_capacity._0_6_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a38._M_dataplus._M_p != &local_a38.field_2) {
    operator_delete(local_a38._M_dataplus._M_p,local_a38.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a58._M_dataplus._M_p != &local_a58.field_2) {
    operator_delete(local_a58._M_dataplus._M_p,local_a58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a78._0_8_ != &aStack_a68) {
    operator_delete((void *)local_a78._0_8_,aStack_a68._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5f0.m_name._M_dataplus._M_p != &local_5f0.m_name.field_2) {
    operator_delete(local_5f0.m_name._M_dataplus._M_p,
                    CONCAT53(local_5f0.m_name.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_5f0.m_name.field_2._M_local_buf[2],
                                      local_5f0.m_name.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8a0.m_name._M_dataplus._M_p != &local_8a0.m_name.field_2) {
    operator_delete(local_8a0.m_name._M_dataplus._M_p,
                    local_8a0.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_838.m_name._M_dataplus._M_p != &local_838.m_name.field_2) {
    operator_delete(local_838.m_name._M_dataplus._M_p,
                    local_838.m_name.field_2._M_allocated_capacity + 1);
  }
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>
            ((LineParametersWithConfidence *)local_9a8,samples,0,
             (int)((ulong)((long)(samples->
                                 super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(samples->
                                super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
                                )._M_impl.super__Vector_impl_data._M_start) >> 3) * 0x38e38e39,1,
             0x10);
  local_838.m_name._M_dataplus._M_p = (pointer)&local_838.m_name.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_838,"SecondDrawCallConstantCost","");
  local_8a0.m_name._M_dataplus._M_p = (pointer)&local_8a0.m_name.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_8a0,"Second DrawCall: Approximated contant cost","");
  local_5f0.m_name._M_dataplus._M_p = (pointer)&local_5f0.m_name.field_2;
  local_5f0.m_name.field_2._M_allocated_capacity._0_2_ = 0x7375;
  local_5f0.m_name._M_string_length = 2;
  local_5f0.m_name.field_2._M_local_buf[2] = '\0';
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)local_a78,&local_838.m_name,&local_8a0.m_name,&local_5f0.m_name,
             QP_KEY_TAG_TIME,(float)local_9a8._0_4_);
  tcu::TestLog::writeFloat
            (log,(char *)local_a78._0_8_,local_a58._M_dataplus._M_p,local_a38._M_dataplus._M_p,
             local_a18,local_a14);
  local_988.m_name._M_dataplus._M_p = (pointer)&local_988.m_name.field_2;
  local_a10.m_name._M_dataplus._M_p = (pointer)0x18;
  local_988.m_name._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_988,(ulong)&local_a10);
  local_988.m_name.field_2._M_allocated_capacity._0_6_ = SUB86(local_a10.m_name._M_dataplus._M_p,0);
  local_988.m_name.field_2._M_local_buf[6] =
       (char)((ulong)local_a10.m_name._M_dataplus._M_p >> 0x30);
  local_988.m_name.field_2._M_local_buf[7] =
       (char)((ulong)local_a10.m_name._M_dataplus._M_p >> 0x38);
  builtin_strncpy(local_988.m_name._M_dataplus._M_p,"SecondDrawCallLinearCost",0x18);
  local_988.m_name._M_string_length = (size_type)local_a10.m_name._M_dataplus._M_p;
  local_988.m_name._M_dataplus._M_p[(long)local_a10.m_name._M_dataplus._M_p] = '\0';
  local_7d0.m_name._M_dataplus._M_p = (pointer)&local_7d0.m_name.field_2;
  local_a10.m_name._M_dataplus._M_p = (char *)0x29;
  local_7d0.m_name._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_7d0,(ulong)&local_a10);
  local_7d0.m_name.field_2._M_allocated_capacity = (size_type)local_a10.m_name._M_dataplus._M_p;
  builtin_strncpy(local_7d0.m_name._M_dataplus._M_p,"Second DrawCall: Approximated linear cost",0x29
                 );
  local_7d0.m_name._M_string_length = (size_type)local_a10.m_name._M_dataplus._M_p;
  local_7d0.m_name._M_dataplus._M_p[(long)local_a10.m_name._M_dataplus._M_p] = '\0';
  local_6c0.m_name._M_dataplus._M_p = (pointer)&local_6c0.m_name.field_2;
  local_6c0.m_name.field_2._M_allocated_capacity._0_4_ = 0x2f207375;
  local_6c0.m_name._M_string_length = 7;
  local_6c0.m_name.field_2._M_allocated_capacity._4_4_ = 0x424d20;
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)local_ae0,&local_988.m_name,&local_7d0.m_name,&local_6c0.m_name,
             QP_KEY_TAG_TIME,(float)local_9a8._12_4_ * 1024.0 * 1024.0);
  tcu::TestLog::writeFloat
            (log,(char *)local_ae0._0_8_,local_ac0._M_dataplus._M_p,local_aa0._M_dataplus._M_p,
             local_a80,local_a7c);
  local_920.m_name._M_dataplus._M_p = (pointer)&local_920.m_name.field_2;
  local_728.m_name._M_dataplus._M_p = (pointer)0x18;
  local_920.m_name._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_920,(ulong)&local_728);
  local_920.m_name.field_2._M_allocated_capacity._0_6_ = SUB86(local_728.m_name._M_dataplus._M_p,0);
  local_920.m_name.field_2._M_local_buf[6] =
       (char)((ulong)local_728.m_name._M_dataplus._M_p >> 0x30);
  local_920.m_name.field_2._M_local_buf[7] =
       (char)((ulong)local_728.m_name._M_dataplus._M_p >> 0x38);
  builtin_strncpy(local_920.m_name._M_dataplus._M_p,"SecondDrawCallMedianCost",0x18);
  local_920.m_name._M_string_length = (size_type)local_728.m_name._M_dataplus._M_p;
  local_920.m_name._M_dataplus._M_p[(long)local_728.m_name._M_dataplus._M_p] = '\0';
  local_728.m_name._M_dataplus._M_p = (pointer)&local_728.m_name.field_2;
  local_658.m_name._M_dataplus._M_p = (pointer)0x1c;
  local_728.m_name._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_728,(ulong)&local_658);
  local_728.m_name.field_2._M_allocated_capacity = (size_type)local_658.m_name._M_dataplus._M_p;
  builtin_strncpy(local_728.m_name._M_dataplus._M_p,"Second DrawCall: Median cost",0x1c);
  local_728.m_name._M_string_length = (size_type)local_658.m_name._M_dataplus._M_p;
  local_728.m_name._M_dataplus._M_p[(long)local_658.m_name._M_dataplus._M_p] = '\0';
  local_658.m_name._M_dataplus._M_p = (pointer)&local_658.m_name.field_2;
  local_658.m_name.field_2._M_allocated_capacity._0_2_ = 0x7375;
  local_658.m_name._M_string_length = 2;
  local_658.m_name.field_2._M_local_buf[2] = '\0';
  tcu::LogNumber<float>::LogNumber
            (&local_a10,&local_920.m_name,&local_728.m_name,&local_658.m_name,QP_KEY_TAG_TIME,
             local_e4.medianTime);
  tcu::TestLog::writeFloat
            (log,local_a10.m_name._M_dataplus._M_p,local_a10.m_desc._M_dataplus._M_p,
             local_a10.m_unit._M_dataplus._M_p,local_a10.m_tag,local_a10.m_value);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a10.m_unit._M_dataplus._M_p != &local_a10.m_unit.field_2) {
    operator_delete(local_a10.m_unit._M_dataplus._M_p,
                    local_a10.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a10.m_desc._M_dataplus._M_p != &local_a10.m_desc.field_2) {
    operator_delete(local_a10.m_desc._M_dataplus._M_p,
                    local_a10.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a10.m_name._M_dataplus._M_p != &local_a10.m_name.field_2) {
    operator_delete(local_a10.m_name._M_dataplus._M_p,
                    local_a10.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_658.m_name._M_dataplus._M_p != &local_658.m_name.field_2) {
    operator_delete(local_658.m_name._M_dataplus._M_p,
                    CONCAT17(local_658.m_name.field_2._M_local_buf[7],
                             CONCAT43(local_658.m_name.field_2._M_allocated_capacity._3_4_,
                                      CONCAT12(local_658.m_name.field_2._M_local_buf[2],
                                               local_658.m_name.field_2._M_allocated_capacity._0_2_)
                                     )) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_728.m_name._M_dataplus._M_p != &local_728.m_name.field_2) {
    operator_delete(local_728.m_name._M_dataplus._M_p,
                    local_728.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_920.m_name._M_dataplus._M_p != &local_920.m_name.field_2) {
    operator_delete(local_920.m_name._M_dataplus._M_p,
                    CONCAT17(local_920.m_name.field_2._M_local_buf[7],
                             CONCAT16(local_920.m_name.field_2._M_local_buf[6],
                                      local_920.m_name.field_2._M_allocated_capacity._0_6_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_aa0._M_dataplus._M_p != &local_aa0.field_2) {
    operator_delete(local_aa0._M_dataplus._M_p,local_aa0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ac0._M_dataplus._M_p != &local_ac0.field_2) {
    operator_delete(local_ac0._M_dataplus._M_p,local_ac0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ae0._0_8_ != &local_ad0) {
    operator_delete((void *)local_ae0._0_8_,local_ad0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6c0.m_name._M_dataplus._M_p != &local_6c0.m_name.field_2) {
    operator_delete(local_6c0.m_name._M_dataplus._M_p,
                    CONCAT44(local_6c0.m_name.field_2._M_allocated_capacity._4_4_,
                             local_6c0.m_name.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7d0.m_name._M_dataplus._M_p != &local_7d0.m_name.field_2) {
    operator_delete(local_7d0.m_name._M_dataplus._M_p,
                    (ulong)(local_7d0.m_name.field_2._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_988.m_name._M_dataplus._M_p != &local_988.m_name.field_2) {
    operator_delete(local_988.m_name._M_dataplus._M_p,
                    CONCAT17(local_988.m_name.field_2._M_local_buf[7],
                             CONCAT16(local_988.m_name.field_2._M_local_buf[6],
                                      local_988.m_name.field_2._M_allocated_capacity._0_6_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a38._M_dataplus._M_p != &local_a38.field_2) {
    operator_delete(local_a38._M_dataplus._M_p,local_a38.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a58._M_dataplus._M_p != &local_a58.field_2) {
    operator_delete(local_a58._M_dataplus._M_p,local_a58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a78._0_8_ != &aStack_a68) {
    operator_delete((void *)local_a78._0_8_,aStack_a68._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5f0.m_name._M_dataplus._M_p != &local_5f0.m_name.field_2) {
    operator_delete(local_5f0.m_name._M_dataplus._M_p,
                    CONCAT53(local_5f0.m_name.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_5f0.m_name.field_2._M_local_buf[2],
                                      local_5f0.m_name.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8a0.m_name._M_dataplus._M_p != &local_8a0.m_name.field_2) {
    operator_delete(local_8a0.m_name._M_dataplus._M_p,
                    local_8a0.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_838.m_name._M_dataplus._M_p != &local_838.m_name.field_2) {
    operator_delete(local_838.m_name._M_dataplus._M_p,
                    local_838.m_name.field_2._M_allocated_capacity + 1);
  }
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>
            ((LineParametersWithConfidence *)local_9a8,samples,0,
             (int)((ulong)((long)(samples->
                                 super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(samples->
                                super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
                                )._M_impl.super__Vector_impl_data._M_start) >> 3) * 0x38e38e39,1,
             0x18);
  local_838.m_name._M_dataplus._M_p = (pointer)&local_838.m_name.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_838,"ReadConstantCost","");
  local_8a0.m_name._M_dataplus._M_p = (pointer)&local_8a0.m_name.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_8a0,"Read: Approximated contant cost","");
  local_5f0.m_name._M_dataplus._M_p = (pointer)&local_5f0.m_name.field_2;
  local_5f0.m_name.field_2._M_allocated_capacity._0_2_ = 0x7375;
  local_5f0.m_name._M_string_length = 2;
  local_5f0.m_name.field_2._M_local_buf[2] = '\0';
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)local_a78,&local_838.m_name,&local_8a0.m_name,&local_5f0.m_name,
             QP_KEY_TAG_TIME,(float)local_9a8._0_4_);
  tcu::TestLog::writeFloat
            (log,(char *)local_a78._0_8_,local_a58._M_dataplus._M_p,local_a38._M_dataplus._M_p,
             local_a18,local_a14);
  local_988.m_name._M_dataplus._M_p = (pointer)&local_988.m_name.field_2;
  local_988.m_name.field_2._M_allocated_capacity._0_6_ = 0x694c64616552;
  local_988.m_name.field_2._M_local_buf[6] = 'n';
  local_988.m_name.field_2._M_local_buf[7] = 'e';
  local_988.m_name.field_2._8_6_ = 0x74736f437261;
  local_988.m_name._M_string_length = 0xe;
  local_988.m_name.field_2._M_local_buf[0xe] = '\0';
  local_7d0.m_name._M_dataplus._M_p = (pointer)&local_7d0.m_name.field_2;
  local_a10.m_name._M_dataplus._M_p = (char *)0x1e;
  local_7d0.m_name._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_7d0,(ulong)&local_a10);
  local_7d0.m_name.field_2._M_allocated_capacity = (size_type)local_a10.m_name._M_dataplus._M_p;
  builtin_strncpy(local_7d0.m_name._M_dataplus._M_p,"Read: Approximated linear cost",0x1e);
  local_7d0.m_name._M_string_length = (size_type)local_a10.m_name._M_dataplus._M_p;
  local_7d0.m_name._M_dataplus._M_p[(long)local_a10.m_name._M_dataplus._M_p] = '\0';
  local_6c0.m_name._M_dataplus._M_p = (pointer)&local_6c0.m_name.field_2;
  local_6c0.m_name.field_2._M_allocated_capacity._0_4_ = 0x2f207375;
  local_6c0.m_name._M_string_length = 7;
  local_6c0.m_name.field_2._M_allocated_capacity._4_4_ = 0x424d20;
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)local_ae0,&local_988.m_name,&local_7d0.m_name,&local_6c0.m_name,
             QP_KEY_TAG_TIME,(float)local_9a8._12_4_ * 1024.0 * 1024.0);
  tcu::TestLog::writeFloat
            (log,(char *)local_ae0._0_8_,local_ac0._M_dataplus._M_p,local_aa0._M_dataplus._M_p,
             local_a80,local_a7c);
  local_920.m_name._M_dataplus._M_p = (pointer)&local_920.m_name.field_2;
  local_920.m_name.field_2._M_allocated_capacity._0_6_ = 0x654d64616552;
  local_920.m_name.field_2._M_local_buf[6] = 'd';
  local_920.m_name.field_2._M_local_buf[7] = 'i';
  local_920.m_name.field_2._8_6_ = 0x74736f436e61;
  local_920.m_name._M_string_length = 0xe;
  local_920.m_name.field_2._M_local_buf[0xe] = '\0';
  local_728.m_name._M_dataplus._M_p = (pointer)&local_728.m_name.field_2;
  local_658.m_name._M_dataplus._M_p = (pointer)0x11;
  local_728.m_name._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_728,(ulong)&local_658);
  local_728.m_name.field_2._M_allocated_capacity = (size_type)local_658.m_name._M_dataplus._M_p;
  builtin_strncpy(local_728.m_name._M_dataplus._M_p,"Read: Median cost",0x11);
  local_728.m_name._M_string_length = (size_type)local_658.m_name._M_dataplus._M_p;
  local_728.m_name._M_dataplus._M_p[(long)local_658.m_name._M_dataplus._M_p] = '\0';
  local_658.m_name._M_dataplus._M_p = (pointer)&local_658.m_name.field_2;
  local_658.m_name.field_2._M_allocated_capacity._0_2_ = 0x7375;
  local_658.m_name._M_string_length = 2;
  local_658.m_name.field_2._M_local_buf[2] = '\0';
  tcu::LogNumber<float>::LogNumber
            (&local_a10,&local_920.m_name,&local_728.m_name,&local_658.m_name,QP_KEY_TAG_TIME,
             local_d0.medianTime);
  tcu::TestLog::writeFloat
            (log,local_a10.m_name._M_dataplus._M_p,local_a10.m_desc._M_dataplus._M_p,
             local_a10.m_unit._M_dataplus._M_p,local_a10.m_tag,local_a10.m_value);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a10.m_unit._M_dataplus._M_p != &local_a10.m_unit.field_2) {
    operator_delete(local_a10.m_unit._M_dataplus._M_p,
                    local_a10.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a10.m_desc._M_dataplus._M_p != &local_a10.m_desc.field_2) {
    operator_delete(local_a10.m_desc._M_dataplus._M_p,
                    local_a10.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a10.m_name._M_dataplus._M_p != &local_a10.m_name.field_2) {
    operator_delete(local_a10.m_name._M_dataplus._M_p,
                    local_a10.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_658.m_name._M_dataplus._M_p != &local_658.m_name.field_2) {
    operator_delete(local_658.m_name._M_dataplus._M_p,
                    CONCAT17(local_658.m_name.field_2._M_local_buf[7],
                             CONCAT43(local_658.m_name.field_2._M_allocated_capacity._3_4_,
                                      CONCAT12(local_658.m_name.field_2._M_local_buf[2],
                                               local_658.m_name.field_2._M_allocated_capacity._0_2_)
                                     )) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_728.m_name._M_dataplus._M_p != &local_728.m_name.field_2) {
    operator_delete(local_728.m_name._M_dataplus._M_p,
                    local_728.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_920.m_name._M_dataplus._M_p != &local_920.m_name.field_2) {
    operator_delete(local_920.m_name._M_dataplus._M_p,
                    CONCAT17(local_920.m_name.field_2._M_local_buf[7],
                             CONCAT16(local_920.m_name.field_2._M_local_buf[6],
                                      local_920.m_name.field_2._M_allocated_capacity._0_6_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_aa0._M_dataplus._M_p != &local_aa0.field_2) {
    operator_delete(local_aa0._M_dataplus._M_p,local_aa0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ac0._M_dataplus._M_p != &local_ac0.field_2) {
    operator_delete(local_ac0._M_dataplus._M_p,local_ac0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ae0._0_8_ != &local_ad0) {
    operator_delete((void *)local_ae0._0_8_,local_ad0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6c0.m_name._M_dataplus._M_p != &local_6c0.m_name.field_2) {
    operator_delete(local_6c0.m_name._M_dataplus._M_p,
                    CONCAT44(local_6c0.m_name.field_2._M_allocated_capacity._4_4_,
                             local_6c0.m_name.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7d0.m_name._M_dataplus._M_p != &local_7d0.m_name.field_2) {
    operator_delete(local_7d0.m_name._M_dataplus._M_p,
                    (ulong)(local_7d0.m_name.field_2._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_988.m_name._M_dataplus._M_p != &local_988.m_name.field_2) {
    operator_delete(local_988.m_name._M_dataplus._M_p,
                    CONCAT17(local_988.m_name.field_2._M_local_buf[7],
                             CONCAT16(local_988.m_name.field_2._M_local_buf[6],
                                      local_988.m_name.field_2._M_allocated_capacity._0_6_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a38._M_dataplus._M_p != &local_a38.field_2) {
    operator_delete(local_a38._M_dataplus._M_p,local_a38.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a58._M_dataplus._M_p != &local_a58.field_2) {
    operator_delete(local_a58._M_dataplus._M_p,local_a58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a78._0_8_ != &aStack_a68) {
    operator_delete((void *)local_a78._0_8_,aStack_a68._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5f0.m_name._M_dataplus._M_p != &local_5f0.m_name.field_2) {
    operator_delete(local_5f0.m_name._M_dataplus._M_p,
                    CONCAT53(local_5f0.m_name.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_5f0.m_name.field_2._M_local_buf[2],
                                      local_5f0.m_name.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8a0.m_name._M_dataplus._M_p != &local_8a0.m_name.field_2) {
    operator_delete(local_8a0.m_name._M_dataplus._M_p,
                    local_8a0.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_838.m_name._M_dataplus._M_p != &local_838.m_name.field_2) {
    operator_delete(local_838.m_name._M_dataplus._M_p,
                    local_838.m_name.field_2._M_allocated_capacity + 1);
  }
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>
            ((LineParametersWithConfidence *)local_9a8,samples,0,
             (int)((ulong)((long)(samples->
                                 super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(samples->
                                super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
                                )._M_impl.super__Vector_impl_data._M_start) >> 3) * 0x38e38e39,1,
             0x20);
  local_838.m_name._M_dataplus._M_p = (pointer)&local_838.m_name.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_838,"TotalConstantCost","");
  local_8a0.m_name._M_dataplus._M_p = (pointer)&local_8a0.m_name.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_8a0,"Total: Approximated contant cost","");
  local_5f0.m_name._M_dataplus._M_p = (pointer)&local_5f0.m_name.field_2;
  local_5f0.m_name.field_2._M_allocated_capacity._0_2_ = 0x7375;
  local_5f0.m_name._M_string_length = 2;
  local_5f0.m_name.field_2._M_local_buf[2] = '\0';
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)local_a78,&local_838.m_name,&local_8a0.m_name,&local_5f0.m_name,
             QP_KEY_TAG_TIME,(float)local_9a8._0_4_);
  tcu::TestLog::writeFloat
            (log,(char *)local_a78._0_8_,local_a58._M_dataplus._M_p,local_a38._M_dataplus._M_p,
             local_a18,local_a14);
  local_988.m_name._M_dataplus._M_p = (pointer)&local_988.m_name.field_2;
  local_988.m_name.field_2._M_allocated_capacity._0_6_ = 0x4c6c61746f54;
  local_988.m_name.field_2._M_local_buf[6] = 'i';
  local_988.m_name.field_2._M_local_buf[7] = 'n';
  local_988.m_name.field_2._8_6_ = 0x736f43726165;
  local_988.m_name.field_2._M_local_buf[0xe] = 't';
  local_988.m_name._M_string_length = 0xf;
  local_988.m_name.field_2._M_local_buf[0xf] = '\0';
  local_7d0.m_name._M_dataplus._M_p = (pointer)&local_7d0.m_name.field_2;
  local_a10.m_name._M_dataplus._M_p = (char *)0x1f;
  local_7d0.m_name._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_7d0,(ulong)&local_a10);
  local_7d0.m_name.field_2._M_allocated_capacity = (size_type)local_a10.m_name._M_dataplus._M_p;
  builtin_strncpy(local_7d0.m_name._M_dataplus._M_p,"Total: Approximated linear cost",0x1f);
  local_7d0.m_name._M_string_length = (size_type)local_a10.m_name._M_dataplus._M_p;
  local_7d0.m_name._M_dataplus._M_p[(long)local_a10.m_name._M_dataplus._M_p] = '\0';
  local_6c0.m_name._M_dataplus._M_p = (pointer)&local_6c0.m_name.field_2;
  local_6c0.m_name.field_2._M_allocated_capacity._0_4_ = 0x2f207375;
  local_6c0.m_name._M_string_length = 7;
  local_6c0.m_name.field_2._M_allocated_capacity._4_4_ = 0x424d20;
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)local_ae0,&local_988.m_name,&local_7d0.m_name,&local_6c0.m_name,
             QP_KEY_TAG_TIME,(float)local_9a8._12_4_ * 1024.0 * 1024.0);
  tcu::TestLog::writeFloat
            (log,(char *)local_ae0._0_8_,local_ac0._M_dataplus._M_p,local_aa0._M_dataplus._M_p,
             local_a80,local_a7c);
  local_920.m_name._M_dataplus._M_p = (pointer)&local_920.m_name.field_2;
  local_920.m_name.field_2._M_allocated_capacity._0_6_ = 0x4d6c61746f54;
  local_920.m_name.field_2._M_local_buf[6] = 'e';
  local_920.m_name.field_2._M_local_buf[7] = 'd';
  local_920.m_name.field_2._8_6_ = 0x736f436e6169;
  local_920.m_name.field_2._M_local_buf[0xe] = 't';
  local_920.m_name._M_string_length = 0xf;
  local_920.m_name.field_2._M_local_buf[0xf] = '\0';
  local_728.m_name._M_dataplus._M_p = (pointer)&local_728.m_name.field_2;
  local_658.m_name._M_dataplus._M_p = (pointer)0x12;
  local_728.m_name._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_728,(ulong)&local_658);
  local_728.m_name.field_2._M_allocated_capacity = (size_type)local_658.m_name._M_dataplus._M_p;
  builtin_strncpy(local_728.m_name._M_dataplus._M_p,"Total: Median cost",0x12);
  local_728.m_name._M_string_length = (size_type)local_658.m_name._M_dataplus._M_p;
  local_728.m_name._M_dataplus._M_p[(long)local_658.m_name._M_dataplus._M_p] = '\0';
  local_658.m_name._M_dataplus._M_p = (pointer)&local_658.m_name.field_2;
  local_658.m_name.field_2._M_allocated_capacity._0_2_ = 0x7375;
  local_658.m_name._M_string_length = 2;
  local_658.m_name.field_2._M_local_buf[2] = '\0';
  tcu::LogNumber<float>::LogNumber
            (&local_a10,&local_920.m_name,&local_728.m_name,&local_658.m_name,QP_KEY_TAG_TIME,
             local_a8.medianTime);
  tcu::TestLog::writeFloat
            (log,local_a10.m_name._M_dataplus._M_p,local_a10.m_desc._M_dataplus._M_p,
             local_a10.m_unit._M_dataplus._M_p,local_a10.m_tag,local_a10.m_value);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a10.m_unit._M_dataplus._M_p != &local_a10.m_unit.field_2) {
    operator_delete(local_a10.m_unit._M_dataplus._M_p,
                    local_a10.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a10.m_desc._M_dataplus._M_p != &local_a10.m_desc.field_2) {
    operator_delete(local_a10.m_desc._M_dataplus._M_p,
                    local_a10.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a10.m_name._M_dataplus._M_p != &local_a10.m_name.field_2) {
    operator_delete(local_a10.m_name._M_dataplus._M_p,
                    local_a10.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_658.m_name._M_dataplus._M_p != &local_658.m_name.field_2) {
    operator_delete(local_658.m_name._M_dataplus._M_p,
                    CONCAT17(local_658.m_name.field_2._M_local_buf[7],
                             CONCAT43(local_658.m_name.field_2._M_allocated_capacity._3_4_,
                                      CONCAT12(local_658.m_name.field_2._M_local_buf[2],
                                               local_658.m_name.field_2._M_allocated_capacity._0_2_)
                                     )) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_728.m_name._M_dataplus._M_p != &local_728.m_name.field_2) {
    operator_delete(local_728.m_name._M_dataplus._M_p,
                    local_728.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_920.m_name._M_dataplus._M_p != &local_920.m_name.field_2) {
    operator_delete(local_920.m_name._M_dataplus._M_p,
                    CONCAT17(local_920.m_name.field_2._M_local_buf[7],
                             CONCAT16(local_920.m_name.field_2._M_local_buf[6],
                                      local_920.m_name.field_2._M_allocated_capacity._0_6_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_aa0._M_dataplus._M_p != &local_aa0.field_2) {
    operator_delete(local_aa0._M_dataplus._M_p,local_aa0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ac0._M_dataplus._M_p != &local_ac0.field_2) {
    operator_delete(local_ac0._M_dataplus._M_p,local_ac0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ae0._0_8_ != &local_ad0) {
    operator_delete((void *)local_ae0._0_8_,local_ad0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6c0.m_name._M_dataplus._M_p != &local_6c0.m_name.field_2) {
    operator_delete(local_6c0.m_name._M_dataplus._M_p,
                    CONCAT44(local_6c0.m_name.field_2._M_allocated_capacity._4_4_,
                             local_6c0.m_name.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7d0.m_name._M_dataplus._M_p != &local_7d0.m_name.field_2) {
    operator_delete(local_7d0.m_name._M_dataplus._M_p,
                    (ulong)(local_7d0.m_name.field_2._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_988.m_name._M_dataplus._M_p != &local_988.m_name.field_2) {
    operator_delete(local_988.m_name._M_dataplus._M_p,
                    CONCAT17(local_988.m_name.field_2._M_local_buf[7],
                             CONCAT16(local_988.m_name.field_2._M_local_buf[6],
                                      local_988.m_name.field_2._M_allocated_capacity._0_6_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a38._M_dataplus._M_p != &local_a38.field_2) {
    operator_delete(local_a38._M_dataplus._M_p,local_a38.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a58._M_dataplus._M_p != &local_a58.field_2) {
    operator_delete(local_a58._M_dataplus._M_p,local_a58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a78._0_8_ != &aStack_a68) {
    operator_delete((void *)local_a78._0_8_,aStack_a68._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5f0.m_name._M_dataplus._M_p != &local_5f0.m_name.field_2) {
    operator_delete(local_5f0.m_name._M_dataplus._M_p,
                    CONCAT53(local_5f0.m_name.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_5f0.m_name.field_2._M_local_buf[2],
                                      local_5f0.m_name.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8a0.m_name._M_dataplus._M_p != &local_8a0.m_name.field_2) {
    operator_delete(local_8a0.m_name._M_dataplus._M_p,
                    local_8a0.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_838.m_name._M_dataplus._M_p != &local_838.m_name.field_2) {
    operator_delete(local_838.m_name._M_dataplus._M_p,
                    local_838.m_name.field_2._M_allocated_capacity + 1);
  }
  tcu::TestLog::endSection((TestLog *)local_588._M_dataplus._M_p);
  local_a78._0_8_ = &aStack_a68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a78,"Results","");
  local_ae0._0_8_ = &local_ad0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_ae0,"Results","");
  tcu::ScopedLogSection::ScopedLogSection(&local_1b8,log,(string *)local_a78,(string *)local_ae0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ae0._0_8_ != &local_ad0) {
    operator_delete((void *)local_ae0._0_8_,local_ad0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a78._0_8_ != &aStack_a68) {
    operator_delete((void *)local_a78._0_8_,aStack_a68._M_allocated_capacity + 1);
  }
  pRVar8 = (samples->
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pRVar2 = (samples->
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  fVar16 = (float)((pRVar2[-1].renderDataSize + pRVar8->renderDataSize) / 2);
  local_1e4 = local_4e4.coefficient * fVar16;
  local_1e0 = local_4e4.offset + local_1e4;
  endNdx = ((int)((ulong)((long)pRVar2 - (long)pRVar8) >> 3) * 0x38e38e39) / 2;
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>
            ((LineParametersWithConfidence *)local_a78,samples,0,endNdx,1,0x30);
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>
            ((LineParametersWithConfidence *)local_ae0,samples,endNdx,
             (int)((ulong)((long)(samples->
                                 super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(samples->
                                super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
                                )._M_impl.super__Vector_impl_data._M_start) >> 3) * 0x38e38e39,1,
             0x30);
  pRVar8 = (samples->
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pRVar2 = (samples->
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  fVar15 = (float)pRVar8->renderDataSize;
  local_1bc = (float)pRVar2[-1].renderDataSize;
  local_8b8._0_4_ = fVar15;
  local_1c8 = (float)local_a78._0_4_;
  local_48 = ZEXT416((uint)local_a78._12_4_);
  local_1c4 = (float)local_ae0._0_4_;
  local_58 = ZEXT416((uint)fStack_ad4);
  local_1c0 = getAreaBetweenLines(fVar15,local_1bc,(float)local_a78._0_4_,(float)local_a78._12_4_,
                                  (float)local_ae0._0_4_,fStack_ad4);
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>
            ((LineParametersWithConfidence *)local_a78,samples,0,
             (int)((ulong)((long)pRVar2 - (long)pRVar8) >> 3) * 0x38e38e39,2,0x30);
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>
            ((LineParametersWithConfidence *)local_ae0,samples,1,
             (int)((ulong)((long)(samples->
                                 super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(samples->
                                super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
                                )._M_impl.super__Vector_impl_data._M_start) >> 3) * 0x38e38e39,2,
             0x30);
  local_1cc = (float)((samples->
                      super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
                      )._M_impl.super__Vector_impl_data._M_start)->renderDataSize;
  local_1d0 = (float)(samples->
                     super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish[-1].renderDataSize;
  local_1dc = (float)local_a78._0_4_;
  local_68 = ZEXT416((uint)local_a78._12_4_);
  local_1d8 = (float)local_ae0._0_4_;
  local_78 = ZEXT416((uint)fStack_ad4);
  local_1d4 = getAreaBetweenLines(local_1cc,local_1d0,(float)local_a78._0_4_,(float)local_a78._12_4_
                                  ,(float)local_ae0._0_4_,fStack_ad4);
  local_9a8._0_8_ = &local_998;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_9a8,"ResultLinearity","");
  local_588._M_dataplus._M_p = (pointer)&local_588.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_588,"Sample linearity","");
  local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"%","");
  fVar15 = (float)local_48._0_4_ * (float)local_8b8._0_4_ + local_1c8;
  fVar17 = (float)local_58._0_4_ * (float)local_8b8._0_4_ + local_1c4;
  uVar10 = -(uint)(fVar15 <= fVar17);
  fVar18 = (float)local_48._0_4_ * local_1bc + local_1c8;
  fVar19 = (float)local_58._0_4_ * local_1bc + local_1c4;
  uVar14 = -(uint)(fVar19 <= fVar18);
  fVar15 = ((float)(~uVar14 & (uint)fVar19 | (uint)fVar18 & uVar14) -
           (float)(~uVar10 & (uint)fVar17 | (uint)fVar15 & uVar10)) *
           (local_1bc - (float)local_8b8._0_4_);
  fVar17 = (float)(~-(uint)(fVar15 < 1e-06) & (uint)(1.0 - local_1c0 / fVar15));
  fVar15 = 1.0;
  if (fVar17 <= 1.0) {
    fVar15 = fVar17;
  }
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)local_a78,(string *)local_9a8,&local_588,&local_208,
             QP_KEY_TAG_QUALITY,(float)(~-(uint)(fVar17 < 0.0) & (uint)(fVar15 * 100.0)));
  tcu::TestLog::writeFloat
            (log,(char *)local_a78._0_8_,local_a58._M_dataplus._M_p,local_a38._M_dataplus._M_p,
             local_a18,local_a14);
  local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"SampleTemporalStability","")
  ;
  local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_248,"Sample temporal stability","");
  local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"%","");
  fVar15 = (float)local_68._0_4_ * local_1cc + local_1dc;
  fVar17 = (float)local_78._0_4_ * local_1cc + local_1d8;
  uVar10 = -(uint)(fVar15 <= fVar17);
  fVar18 = (float)local_68._0_4_ * local_1d0 + local_1dc;
  fVar19 = (float)local_78._0_4_ * local_1d0 + local_1d8;
  uVar14 = -(uint)(fVar19 <= fVar18);
  fVar15 = ((float)(~uVar14 & (uint)fVar19 | (uint)fVar18 & uVar14) -
           (float)(~uVar10 & (uint)fVar17 | (uint)fVar15 & uVar10)) * (local_1d0 - local_1cc);
  fVar17 = (float)(~-(uint)(fVar15 < 1e-06) & (uint)(1.0 - local_1d4 / fVar15));
  fVar15 = 1.0;
  if (fVar17 <= 1.0) {
    fVar15 = fVar17;
  }
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)local_ae0,&local_228,&local_248,&local_268,QP_KEY_TAG_QUALITY,
             (float)(~-(uint)(fVar17 < 0.0) & (uint)(fVar15 * 100.0)));
  tcu::TestLog::writeFloat
            (log,(char *)local_ae0._0_8_,local_ac0._M_dataplus._M_p,local_aa0._M_dataplus._M_p,
             local_a80,local_a7c);
  local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_288,"ApproximatedConstantCost","");
  local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2a8,"Approximated contant cost","");
  local_508._M_dataplus._M_p = (pointer)&local_508.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_508,"us","");
  tcu::LogNumber<float>::LogNumber
            (&local_a10,&local_288,&local_2a8,&local_508,QP_KEY_TAG_TIME,local_4e4.offset);
  tcu::TestLog::writeFloat
            (log,local_a10.m_name._M_dataplus._M_p,local_a10.m_desc._M_dataplus._M_p,
             local_a10.m_unit._M_dataplus._M_p,local_a10.m_tag,local_a10.m_value);
  local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2c8,"ApproximatedConstantCostConfidence60Lower","");
  local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2e8,"Approximated contant cost 60% confidence lower limit","");
  local_528._M_dataplus._M_p = (pointer)&local_528.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_528,"us","");
  tcu::LogNumber<float>::LogNumber
            (&local_838,&local_2c8,&local_2e8,&local_528,QP_KEY_TAG_TIME,
             local_4e4.offsetConfidenceLower);
  tcu::TestLog::writeFloat
            (log,local_838.m_name._M_dataplus._M_p,local_838.m_desc._M_dataplus._M_p,
             local_838.m_unit._M_dataplus._M_p,local_838.m_tag,local_838.m_value);
  local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_308,"ApproximatedConstantCostConfidence60Upper","");
  local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_328,"Approximated contant cost 60% confidence upper limit","");
  local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_348,"us","");
  tcu::LogNumber<float>::LogNumber
            (&local_8a0,&local_308,&local_328,&local_348,QP_KEY_TAG_TIME,
             local_4e4.offsetConfidenceUpper);
  tcu::TestLog::writeFloat
            (log,local_8a0.m_name._M_dataplus._M_p,local_8a0.m_desc._M_dataplus._M_p,
             local_8a0.m_unit._M_dataplus._M_p,local_8a0.m_tag,local_8a0.m_value);
  local_368._M_dataplus._M_p = (pointer)&local_368.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_368,"ApproximatedLinearCost","");
  local_748._M_dataplus._M_p = (pointer)&local_748.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_748,"Approximated linear cost","");
  local_548._M_dataplus._M_p = (pointer)&local_548.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_548,"us / MB","");
  tcu::LogNumber<float>::LogNumber
            (&local_5f0,&local_368,&local_748,&local_548,QP_KEY_TAG_TIME,
             local_4e4.coefficient * 1024.0 * 1024.0);
  tcu::TestLog::writeFloat
            (log,local_5f0.m_name._M_dataplus._M_p,local_5f0.m_desc._M_dataplus._M_p,
             local_5f0.m_unit._M_dataplus._M_p,local_5f0.m_tag,local_5f0.m_value);
  local_388._M_dataplus._M_p = (pointer)&local_388.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_388,"ApproximatedLinearCostConfidence60Lower","");
  local_3a8._M_dataplus._M_p = (pointer)&local_3a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_3a8,"Approximated linear cost 60% confidence lower limit","");
  local_3c8._M_dataplus._M_p = (pointer)&local_3c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c8,"us / MB","");
  tcu::LogNumber<float>::LogNumber
            (&local_988,&local_388,&local_3a8,&local_3c8,QP_KEY_TAG_TIME,
             local_4e4.coefficientConfidenceLower * 1024.0 * 1024.0);
  tcu::TestLog::writeFloat
            (log,local_988.m_name._M_dataplus._M_p,local_988.m_desc._M_dataplus._M_p,
             local_988.m_unit._M_dataplus._M_p,local_988.m_tag,local_988.m_value);
  local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_3e8,"ApproximatedLinearCostConfidence60Upper","");
  local_768._M_dataplus._M_p = (pointer)&local_768.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_768,"Approximated linear cost 60% confidence upper limit","");
  local_568._M_dataplus._M_p = (pointer)&local_568.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_568,"us / MB","");
  tcu::LogNumber<float>::LogNumber
            (&local_7d0,&local_3e8,&local_768,&local_568,QP_KEY_TAG_TIME,
             local_4e4.coefficientConfidenceUpper * 1024.0 * 1024.0);
  tcu::TestLog::writeFloat
            (log,local_7d0.m_name._M_dataplus._M_p,local_7d0.m_desc._M_dataplus._M_p,
             local_7d0.m_unit._M_dataplus._M_p,local_7d0.m_tag,local_7d0.m_value);
  local_408._M_dataplus._M_p = (pointer)&local_408.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_408,"ApproximatedProcessRate","")
  ;
  local_428._M_dataplus._M_p = (pointer)&local_428.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_428,"Approximated processing rate","");
  local_448._M_dataplus._M_p = (pointer)&local_448.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_448,"MB / s","");
  fVar15 = fVar16 / ((local_1e0 / 1000.0) / 1000.0);
  local_8b8 = ZEXT416((uint)fVar15);
  tcu::LogNumber<float>::LogNumber
            (&local_6c0,&local_408,&local_428,&local_448,QP_KEY_TAG_PERFORMANCE,
             fVar15 * 0.0009765625 * 0.0009765625);
  tcu::TestLog::writeFloat
            (log,local_6c0.m_name._M_dataplus._M_p,local_6c0.m_desc._M_dataplus._M_p,
             local_6c0.m_unit._M_dataplus._M_p,local_6c0.m_tag,local_6c0.m_value);
  local_468._M_dataplus._M_p = (pointer)&local_468.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_468,"ApproximatedProcessRateNoConstant","");
  local_488._M_dataplus._M_p = (pointer)&local_488.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_488,"Approximated processing rate without constant cost","");
  local_4a8._M_dataplus._M_p = (pointer)&local_4a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4a8,"MB / s","");
  tcu::LogNumber<float>::LogNumber
            (&local_920,&local_468,&local_488,&local_4a8,QP_KEY_TAG_PERFORMANCE,
             (fVar16 / ((local_1e4 / 1000.0) / 1000.0)) * 0.0009765625 * 0.0009765625);
  tcu::TestLog::writeFloat
            (log,local_920.m_name._M_dataplus._M_p,local_920.m_desc._M_dataplus._M_p,
             local_920.m_unit._M_dataplus._M_p,local_920.m_tag,local_920.m_value);
  local_4c8._M_dataplus._M_p = (pointer)&local_4c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4c8,"SampleMedianTime","");
  local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"Median sample time","");
  local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"us","");
  tcu::LogNumber<float>::LogNumber
            (&local_728,&local_4c8,&local_1b0,&local_130,QP_KEY_TAG_TIME,local_b4);
  tcu::TestLog::writeFloat
            (log,local_728.m_name._M_dataplus._M_p,local_728.m_desc._M_dataplus._M_p,
             local_728.m_unit._M_dataplus._M_p,local_728.m_tag,local_728.m_value);
  local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"SampleMedianProcess","");
  local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"Median processing rate","");
  local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"MB / s","");
  tcu::LogNumber<float>::LogNumber
            (&local_658,&local_150,&local_170,&local_190,QP_KEY_TAG_PERFORMANCE,
             local_94 * 0.0009765625 * 0.0009765625);
  tcu::TestLog::writeFloat
            (log,local_658.m_name._M_dataplus._M_p,local_658.m_desc._M_dataplus._M_p,
             local_658.m_unit._M_dataplus._M_p,local_658.m_tag,local_658.m_value);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_658.m_unit._M_dataplus._M_p != &local_658.m_unit.field_2) {
    operator_delete(local_658.m_unit._M_dataplus._M_p,
                    local_658.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_658.m_desc._M_dataplus._M_p != &local_658.m_desc.field_2) {
    operator_delete(local_658.m_desc._M_dataplus._M_p,
                    local_658.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_658.m_name._M_dataplus._M_p != &local_658.m_name.field_2) {
    operator_delete(local_658.m_name._M_dataplus._M_p,
                    CONCAT17(local_658.m_name.field_2._M_local_buf[7],
                             CONCAT43(local_658.m_name.field_2._M_allocated_capacity._3_4_,
                                      CONCAT12(local_658.m_name.field_2._M_local_buf[2],
                                               local_658.m_name.field_2._M_allocated_capacity._0_2_)
                                     )) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != &local_190.field_2) {
    operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != &local_170.field_2) {
    operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_728.m_unit._M_dataplus._M_p != &local_728.m_unit.field_2) {
    operator_delete(local_728.m_unit._M_dataplus._M_p,
                    local_728.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_728.m_desc._M_dataplus._M_p != &local_728.m_desc.field_2) {
    operator_delete(local_728.m_desc._M_dataplus._M_p,
                    local_728.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_728.m_name._M_dataplus._M_p != &local_728.m_name.field_2) {
    operator_delete(local_728.m_name._M_dataplus._M_p,
                    local_728.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
    operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c8._M_dataplus._M_p != &local_4c8.field_2) {
    operator_delete(local_4c8._M_dataplus._M_p,
                    CONCAT53(local_4c8.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_4c8.field_2._M_local_buf[2],
                                      local_4c8.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_920.m_unit._M_dataplus._M_p != &local_920.m_unit.field_2) {
    operator_delete(local_920.m_unit._M_dataplus._M_p,
                    local_920.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_920.m_desc._M_dataplus._M_p != &local_920.m_desc.field_2) {
    operator_delete(local_920.m_desc._M_dataplus._M_p,
                    local_920.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_920.m_name._M_dataplus._M_p != &local_920.m_name.field_2) {
    operator_delete(local_920.m_name._M_dataplus._M_p,
                    CONCAT17(local_920.m_name.field_2._M_local_buf[7],
                             CONCAT16(local_920.m_name.field_2._M_local_buf[6],
                                      local_920.m_name.field_2._M_allocated_capacity._0_6_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4a8._M_dataplus._M_p != &local_4a8.field_2) {
    operator_delete(local_4a8._M_dataplus._M_p,local_4a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_488._M_dataplus._M_p != &local_488.field_2) {
    operator_delete(local_488._M_dataplus._M_p,
                    CONCAT17(local_488.field_2._M_local_buf[7],
                             local_488.field_2._M_allocated_capacity._0_7_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_468._M_dataplus._M_p != &local_468.field_2) {
    operator_delete(local_468._M_dataplus._M_p,
                    CONCAT53(local_468.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_468.field_2._M_local_buf[2],
                                      local_468.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6c0.m_unit._M_dataplus._M_p != &local_6c0.m_unit.field_2) {
    operator_delete(local_6c0.m_unit._M_dataplus._M_p,
                    local_6c0.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6c0.m_desc._M_dataplus._M_p != &local_6c0.m_desc.field_2) {
    operator_delete(local_6c0.m_desc._M_dataplus._M_p,
                    local_6c0.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6c0.m_name._M_dataplus._M_p != &local_6c0.m_name.field_2) {
    operator_delete(local_6c0.m_name._M_dataplus._M_p,
                    CONCAT44(local_6c0.m_name.field_2._M_allocated_capacity._4_4_,
                             local_6c0.m_name.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_448._M_dataplus._M_p != &local_448.field_2) {
    operator_delete(local_448._M_dataplus._M_p,
                    CONCAT17(local_448.field_2._M_local_buf[7],
                             local_448.field_2._M_allocated_capacity._0_7_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_428._M_dataplus._M_p != &local_428.field_2) {
    operator_delete(local_428._M_dataplus._M_p,local_428.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_408._M_dataplus._M_p != &local_408.field_2) {
    operator_delete(local_408._M_dataplus._M_p,
                    CONCAT53(local_408.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_408.field_2._M_local_buf[2],
                                      local_408.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7d0.m_unit._M_dataplus._M_p != &local_7d0.m_unit.field_2) {
    operator_delete(local_7d0.m_unit._M_dataplus._M_p,
                    local_7d0.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7d0.m_desc._M_dataplus._M_p != &local_7d0.m_desc.field_2) {
    operator_delete(local_7d0.m_desc._M_dataplus._M_p,
                    local_7d0.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7d0.m_name._M_dataplus._M_p != &local_7d0.m_name.field_2) {
    operator_delete(local_7d0.m_name._M_dataplus._M_p,
                    (ulong)(local_7d0.m_name.field_2._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_568._M_dataplus._M_p != &local_568.field_2) {
    operator_delete(local_568._M_dataplus._M_p,(ulong)(local_568.field_2._M_allocated_capacity + 1))
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_768._M_dataplus._M_p != &local_768.field_2) {
    operator_delete(local_768._M_dataplus._M_p,(ulong)(local_768.field_2._M_allocated_capacity + 1))
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
    operator_delete(local_3e8._M_dataplus._M_p,
                    CONCAT53(local_3e8.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_3e8.field_2._M_local_buf[2],
                                      local_3e8.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_988.m_unit._M_dataplus._M_p != &local_988.m_unit.field_2) {
    operator_delete(local_988.m_unit._M_dataplus._M_p,
                    local_988.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_988.m_desc._M_dataplus._M_p != &local_988.m_desc.field_2) {
    operator_delete(local_988.m_desc._M_dataplus._M_p,
                    local_988.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_988.m_name._M_dataplus._M_p != &local_988.m_name.field_2) {
    operator_delete(local_988.m_name._M_dataplus._M_p,
                    CONCAT17(local_988.m_name.field_2._M_local_buf[7],
                             CONCAT16(local_988.m_name.field_2._M_local_buf[6],
                                      local_988.m_name.field_2._M_allocated_capacity._0_6_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
    operator_delete(local_3c8._M_dataplus._M_p,
                    CONCAT17(local_3c8.field_2._M_local_buf[7],
                             local_3c8.field_2._M_allocated_capacity._0_7_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
    operator_delete(local_3a8._M_dataplus._M_p,
                    CONCAT17(local_3a8.field_2._M_local_buf[7],
                             local_3a8.field_2._M_allocated_capacity._0_7_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_388._M_dataplus._M_p != &local_388.field_2) {
    operator_delete(local_388._M_dataplus._M_p,
                    CONCAT53(local_388.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_388.field_2._M_local_buf[2],
                                      local_388.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5f0.m_unit._M_dataplus._M_p != &local_5f0.m_unit.field_2) {
    operator_delete(local_5f0.m_unit._M_dataplus._M_p,
                    local_5f0.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5f0.m_desc._M_dataplus._M_p != &local_5f0.m_desc.field_2) {
    operator_delete(local_5f0.m_desc._M_dataplus._M_p,
                    local_5f0.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5f0.m_name._M_dataplus._M_p != &local_5f0.m_name.field_2) {
    operator_delete(local_5f0.m_name._M_dataplus._M_p,
                    CONCAT53(local_5f0.m_name.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_5f0.m_name.field_2._M_local_buf[2],
                                      local_5f0.m_name.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_548._M_dataplus._M_p != &local_548.field_2) {
    operator_delete(local_548._M_dataplus._M_p,(ulong)(local_548.field_2._M_allocated_capacity + 1))
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_748._M_dataplus._M_p != &local_748.field_2) {
    operator_delete(local_748._M_dataplus._M_p,(ulong)(local_748.field_2._M_allocated_capacity + 1))
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368._M_dataplus._M_p != &local_368.field_2) {
    operator_delete(local_368._M_dataplus._M_p,
                    CONCAT53(local_368.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_368.field_2._M_local_buf[2],
                                      local_368.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8a0.m_unit._M_dataplus._M_p != &local_8a0.m_unit.field_2) {
    operator_delete(local_8a0.m_unit._M_dataplus._M_p,
                    local_8a0.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8a0.m_desc._M_dataplus._M_p != &local_8a0.m_desc.field_2) {
    operator_delete(local_8a0.m_desc._M_dataplus._M_p,
                    local_8a0.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8a0.m_name._M_dataplus._M_p != &local_8a0.m_name.field_2) {
    operator_delete(local_8a0.m_name._M_dataplus._M_p,
                    local_8a0.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_348._M_dataplus._M_p != &local_348.field_2) {
    operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_328._M_dataplus._M_p != &local_328.field_2) {
    operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_308._M_dataplus._M_p != &local_308.field_2) {
    operator_delete(local_308._M_dataplus._M_p,
                    CONCAT53(local_308.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_308.field_2._M_local_buf[2],
                                      local_308.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_838.m_unit._M_dataplus._M_p != &local_838.m_unit.field_2) {
    operator_delete(local_838.m_unit._M_dataplus._M_p,
                    local_838.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_838.m_desc._M_dataplus._M_p != &local_838.m_desc.field_2) {
    operator_delete(local_838.m_desc._M_dataplus._M_p,
                    local_838.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_838.m_name._M_dataplus._M_p != &local_838.m_name.field_2) {
    operator_delete(local_838.m_name._M_dataplus._M_p,
                    local_838.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_528._M_dataplus._M_p != &local_528.field_2) {
    operator_delete(local_528._M_dataplus._M_p,(ulong)(local_528.field_2._M_allocated_capacity + 1))
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
    operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
    operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a10.m_unit._M_dataplus._M_p != &local_a10.m_unit.field_2) {
    operator_delete(local_a10.m_unit._M_dataplus._M_p,
                    local_a10.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a10.m_desc._M_dataplus._M_p != &local_a10.m_desc.field_2) {
    operator_delete(local_a10.m_desc._M_dataplus._M_p,
                    local_a10.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a10.m_name._M_dataplus._M_p != &local_a10.m_name.field_2) {
    operator_delete(local_a10.m_name._M_dataplus._M_p,
                    local_a10.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_508._M_dataplus._M_p != &local_508.field_2) {
    operator_delete(local_508._M_dataplus._M_p,(ulong)(local_508.field_2._M_allocated_capacity + 1))
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
    operator_delete(local_2a8._M_dataplus._M_p,
                    CONCAT17(local_2a8.field_2._M_local_buf[7],
                             local_2a8.field_2._M_allocated_capacity._0_7_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p != &local_288.field_2) {
    operator_delete(local_288._M_dataplus._M_p,
                    CONCAT26(local_288.field_2._M_allocated_capacity._6_2_,
                             CONCAT24(local_288.field_2._M_allocated_capacity._4_2_,
                                      local_288.field_2._M_allocated_capacity._0_4_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_aa0._M_dataplus._M_p != &local_aa0.field_2) {
    operator_delete(local_aa0._M_dataplus._M_p,local_aa0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ac0._M_dataplus._M_p != &local_ac0.field_2) {
    operator_delete(local_ac0._M_dataplus._M_p,local_ac0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ae0._0_8_ != &local_ad0) {
    operator_delete((void *)local_ae0._0_8_,local_ad0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != &local_268.field_2) {
    operator_delete(local_268._M_dataplus._M_p,
                    CONCAT35(local_268.field_2._M_allocated_capacity._5_3_,
                             local_268.field_2._M_allocated_capacity._0_5_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != &local_248.field_2) {
    operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != &local_228.field_2) {
    operator_delete(local_228._M_dataplus._M_p,
                    CONCAT26(local_228.field_2._M_allocated_capacity._6_2_,
                             CONCAT24(local_228.field_2._M_allocated_capacity._4_2_,
                                      local_228.field_2._M_allocated_capacity._0_4_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a38._M_dataplus._M_p != &local_a38.field_2) {
    operator_delete(local_a38._M_dataplus._M_p,local_a38.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a58._M_dataplus._M_p != &local_a58.field_2) {
    operator_delete(local_a58._M_dataplus._M_p,local_a58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a78._0_8_ != &aStack_a68) {
    operator_delete((void *)local_a78._0_8_,aStack_a68._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p,
                    CONCAT26(local_208.field_2._M_allocated_capacity._6_2_,
                             local_208.field_2._M_allocated_capacity._0_6_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_588._M_dataplus._M_p != &local_588.field_2) {
    operator_delete(local_588._M_dataplus._M_p,local_588.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9a8._0_8_ != &local_998) {
    operator_delete((void *)local_9a8._0_8_,
                    CONCAT44(local_998._M_allocated_capacity._4_4_,
                             local_998._M_allocated_capacity._0_4_) + 1);
  }
  tcu::TestLog::endSection(local_1b8.m_log);
  RVar20.renderRateAtRange = (float)local_8b8._0_4_;
  RVar20.renderRateMedian = local_94;
  RVar20.renderRateAtInfinity = local_94;
  return RVar20;
}

Assistant:

static RenderSampleAnalyzeResult analyzeSampleResults (tcu::TestLog& log, const std::vector<RenderSampleResult<SampleType> >& samples)
{
	// Assume data is linear with some outliers, fit a line
	const LineParametersWithConfidence						theilSenFitting						= fitLineToSamples(samples);
	const typename SampleTypeTraits<SampleType>::StatsType	resultStats							= calculateSampleStatistics(theilSenFitting, samples);
	float													approximatedProcessingRate;
	float													approximatedProcessingRateNoConstant;

	// output raw samples
	{
		const tcu::ScopedLogSection	section(log, "Samples", "Samples");
		logSampleList(log, theilSenFitting, samples);
	}

	// Contributions
	if (SampleTypeTraits<SampleType>::LOG_CONTRIBUTIONS)
	{
		const tcu::ScopedLogSection	section(log, "Contribution", "Contributions");

		logFirstRenderContribution(log, samples, resultStats);
		logUploadContribution(log, samples, resultStats);
		logRenderContribution(log, samples, resultStats);
		logSecondRenderContribution(log, samples, resultStats);
		logReadContribution(log, samples, resultStats);
		logTotalContribution(log, samples, resultStats);
	}

	// print results
	{
		const tcu::ScopedLogSection	section(log, "Results", "Results");

		const int	medianDataSize						= (samples.front().renderDataSize + samples.back().renderDataSize) / 2;
		const float	approximatedRenderTime				= (theilSenFitting.offset + theilSenFitting.coefficient * (float)medianDataSize) / 1000.0f / 1000.0f;
		const float	approximatedRenderTimeNoConstant	= (theilSenFitting.coefficient * (float)medianDataSize) / 1000.0f / 1000.0f;
		const float	sampleLinearity						= calculateSampleFitLinearity(samples);
		const float	sampleTemporalStability				= calculateSampleTemporalStability(samples);

		approximatedProcessingRateNoConstant			= (float)medianDataSize / approximatedRenderTimeNoConstant;
		approximatedProcessingRate						= (float)medianDataSize / approximatedRenderTime;

		log	<< tcu::TestLog::Float("ResultLinearity", "Sample linearity", "%", QP_KEY_TAG_QUALITY, sampleLinearity * 100.0f)
			<< tcu::TestLog::Float("SampleTemporalStability", "Sample temporal stability", "%", QP_KEY_TAG_QUALITY, sampleTemporalStability * 100.0f)
			<< tcu::TestLog::Float("ApproximatedConstantCost", "Approximated contant cost", "us", QP_KEY_TAG_TIME, theilSenFitting.offset)
			<< tcu::TestLog::Float("ApproximatedConstantCostConfidence60Lower", "Approximated contant cost 60% confidence lower limit", "us", QP_KEY_TAG_TIME, theilSenFitting.offsetConfidenceLower)
			<< tcu::TestLog::Float("ApproximatedConstantCostConfidence60Upper", "Approximated contant cost 60% confidence upper limit", "us", QP_KEY_TAG_TIME, theilSenFitting.offsetConfidenceUpper)
			<< tcu::TestLog::Float("ApproximatedLinearCost", "Approximated linear cost", "us / MB", QP_KEY_TAG_TIME, theilSenFitting.coefficient * 1024.0f * 1024.0f)
			<< tcu::TestLog::Float("ApproximatedLinearCostConfidence60Lower", "Approximated linear cost 60% confidence lower limit", "us / MB", QP_KEY_TAG_TIME, theilSenFitting.coefficientConfidenceLower * 1024.0f * 1024.0f)
			<< tcu::TestLog::Float("ApproximatedLinearCostConfidence60Upper", "Approximated linear cost 60% confidence upper limit", "us / MB", QP_KEY_TAG_TIME, theilSenFitting.coefficientConfidenceUpper * 1024.0f * 1024.0f)
			<< tcu::TestLog::Float("ApproximatedProcessRate", "Approximated processing rate", "MB / s", QP_KEY_TAG_PERFORMANCE, approximatedProcessingRate / 1024.0f / 1024.0f)
			<< tcu::TestLog::Float("ApproximatedProcessRateNoConstant", "Approximated processing rate without constant cost", "MB / s", QP_KEY_TAG_PERFORMANCE, approximatedProcessingRateNoConstant / 1024.0f / 1024.0f)
			<< tcu::TestLog::Float("SampleMedianTime", "Median sample time", "us", QP_KEY_TAG_TIME, resultStats.result.medianTime)
			<< tcu::TestLog::Float("SampleMedianProcess", "Median processing rate", "MB / s", QP_KEY_TAG_PERFORMANCE, resultStats.medianRate / 1024.0f / 1024.0f);
	}

	// return approximated render rate
	{
		RenderSampleAnalyzeResult result;

		result.renderRateMedian		= resultStats.medianRate;
		result.renderRateAtRange	= approximatedProcessingRate;
		result.renderRateAtInfinity = approximatedProcessingRateNoConstant;

		return result;
	}
	return RenderSampleAnalyzeResult();
}